

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  int iVar57;
  int iVar58;
  int iVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  byte bVar70;
  byte bVar71;
  byte bVar72;
  ulong uVar73;
  ulong uVar74;
  uint uVar75;
  byte bVar76;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  Primitive *pPVar77;
  uint uVar78;
  long lVar79;
  bool bVar80;
  ulong uVar81;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar138 [32];
  uint uVar145;
  float pp;
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar167;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar168;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  float fVar208;
  float fVar209;
  undefined4 uVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  float fVar230;
  float fVar231;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar232;
  float fVar234;
  undefined1 auVar228 [16];
  float fVar233;
  float fVar235;
  float fVar236;
  undefined1 auVar229 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  float fVar240;
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_940 [16];
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  uint local_8d4;
  uint local_8d0;
  undefined4 local_8cc;
  float local_8c8;
  float local_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  RTCFilterFunctionNArguments local_870;
  undefined1 local_840 [16];
  Primitive *local_828;
  Primitive *local_820;
  ulong local_818;
  ulong local_810;
  ulong local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  float local_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  RTCHitN local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  uint local_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  uint uStack_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar134 [32];
  undefined1 auVar137 [32];
  
  PVar2 = prim[1];
  uVar74 = (ulong)(byte)PVar2;
  lVar79 = uVar74 * 0x19;
  fVar209 = *(float *)(prim + lVar79 + 0x12);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar92 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar91 = vsubps_avx(auVar84,*(undefined1 (*) [16])(prim + lVar79 + 6));
  fVar208 = fVar209 * auVar91._0_4_;
  fVar146 = fVar209 * auVar92._0_4_;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar74 * 4 + 6);
  auVar98 = vpmovsxbd_avx2(auVar84);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar74 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar85);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar74 * 6 + 6);
  auVar99 = vpmovsxbd_avx2(auVar86);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar74 * 0xb + 6);
  auVar100 = vpmovsxbd_avx2(auVar87);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar105 = vpmovsxbd_avx2(auVar82);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar101 = vcvtdq2ps_avx(auVar105);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar74 + 6);
  auVar97 = vpmovsxbd_avx2(auVar89);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar81 = (ulong)(uint)((int)(uVar74 * 9) * 2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar102 = vpmovsxbd_avx2(auVar88);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar81 + uVar74 + 6);
  auVar103 = vpmovsxbd_avx2(auVar83);
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar73 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar95 = vpmovsxbd_avx2(auVar90);
  auVar104 = vcvtdq2ps_avx(auVar95);
  auVar115._4_4_ = fVar146;
  auVar115._0_4_ = fVar146;
  auVar115._8_4_ = fVar146;
  auVar115._12_4_ = fVar146;
  auVar115._16_4_ = fVar146;
  auVar115._20_4_ = fVar146;
  auVar115._24_4_ = fVar146;
  auVar115._28_4_ = fVar146;
  auVar117._8_4_ = 1;
  auVar117._0_8_ = 0x100000001;
  auVar117._12_4_ = 1;
  auVar117._16_4_ = 1;
  auVar117._20_4_ = 1;
  auVar117._24_4_ = 1;
  auVar117._28_4_ = 1;
  auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar107 = ZEXT1632(CONCAT412(fVar209 * auVar92._12_4_,
                                CONCAT48(fVar209 * auVar92._8_4_,
                                         CONCAT44(fVar209 * auVar92._4_4_,fVar146))));
  auVar106 = vpermps_avx2(auVar117,auVar107);
  auVar94 = vpermps_avx512vl(auVar93,auVar107);
  fVar146 = auVar94._0_4_;
  fVar230 = auVar94._4_4_;
  auVar107._4_4_ = fVar230 * auVar99._4_4_;
  auVar107._0_4_ = fVar146 * auVar99._0_4_;
  fVar231 = auVar94._8_4_;
  auVar107._8_4_ = fVar231 * auVar99._8_4_;
  fVar233 = auVar94._12_4_;
  auVar107._12_4_ = fVar233 * auVar99._12_4_;
  fVar240 = auVar94._16_4_;
  auVar107._16_4_ = fVar240 * auVar99._16_4_;
  fVar167 = auVar94._20_4_;
  auVar107._20_4_ = fVar167 * auVar99._20_4_;
  fVar235 = auVar94._24_4_;
  auVar107._24_4_ = fVar235 * auVar99._24_4_;
  auVar107._28_4_ = auVar105._28_4_;
  auVar105._4_4_ = auVar97._4_4_ * fVar230;
  auVar105._0_4_ = auVar97._0_4_ * fVar146;
  auVar105._8_4_ = auVar97._8_4_ * fVar231;
  auVar105._12_4_ = auVar97._12_4_ * fVar233;
  auVar105._16_4_ = auVar97._16_4_ * fVar240;
  auVar105._20_4_ = auVar97._20_4_ * fVar167;
  auVar105._24_4_ = auVar97._24_4_ * fVar235;
  auVar105._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar104._4_4_ * fVar230;
  auVar95._0_4_ = auVar104._0_4_ * fVar146;
  auVar95._8_4_ = auVar104._8_4_ * fVar231;
  auVar95._12_4_ = auVar104._12_4_ * fVar233;
  auVar95._16_4_ = auVar104._16_4_ * fVar240;
  auVar95._20_4_ = auVar104._20_4_ * fVar167;
  auVar95._24_4_ = auVar104._24_4_ * fVar235;
  auVar95._28_4_ = auVar94._28_4_;
  auVar84 = vfmadd231ps_fma(auVar107,auVar106,auVar96);
  auVar85 = vfmadd231ps_fma(auVar105,auVar106,auVar101);
  auVar86 = vfmadd231ps_fma(auVar95,auVar103,auVar106);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar115,auVar98);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar115,auVar100);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar102,auVar115);
  auVar116._4_4_ = fVar208;
  auVar116._0_4_ = fVar208;
  auVar116._8_4_ = fVar208;
  auVar116._12_4_ = fVar208;
  auVar116._16_4_ = fVar208;
  auVar116._20_4_ = fVar208;
  auVar116._24_4_ = fVar208;
  auVar116._28_4_ = fVar208;
  auVar95 = ZEXT1632(CONCAT412(fVar209 * auVar91._12_4_,
                               CONCAT48(fVar209 * auVar91._8_4_,
                                        CONCAT44(fVar209 * auVar91._4_4_,fVar208))));
  auVar105 = vpermps_avx2(auVar117,auVar95);
  auVar95 = vpermps_avx512vl(auVar93,auVar95);
  fVar209 = auVar95._0_4_;
  fVar146 = auVar95._4_4_;
  auVar106._4_4_ = fVar146 * auVar99._4_4_;
  auVar106._0_4_ = fVar209 * auVar99._0_4_;
  fVar230 = auVar95._8_4_;
  auVar106._8_4_ = fVar230 * auVar99._8_4_;
  fVar231 = auVar95._12_4_;
  auVar106._12_4_ = fVar231 * auVar99._12_4_;
  fVar233 = auVar95._16_4_;
  auVar106._16_4_ = fVar233 * auVar99._16_4_;
  fVar240 = auVar95._20_4_;
  auVar106._20_4_ = fVar240 * auVar99._20_4_;
  fVar167 = auVar95._24_4_;
  auVar106._24_4_ = fVar167 * auVar99._24_4_;
  auVar106._28_4_ = 1;
  auVar93._4_4_ = auVar97._4_4_ * fVar146;
  auVar93._0_4_ = auVar97._0_4_ * fVar209;
  auVar93._8_4_ = auVar97._8_4_ * fVar230;
  auVar93._12_4_ = auVar97._12_4_ * fVar231;
  auVar93._16_4_ = auVar97._16_4_ * fVar233;
  auVar93._20_4_ = auVar97._20_4_ * fVar240;
  auVar93._24_4_ = auVar97._24_4_ * fVar167;
  auVar93._28_4_ = auVar99._28_4_;
  auVar97._4_4_ = auVar104._4_4_ * fVar146;
  auVar97._0_4_ = auVar104._0_4_ * fVar209;
  auVar97._8_4_ = auVar104._8_4_ * fVar230;
  auVar97._12_4_ = auVar104._12_4_ * fVar231;
  auVar97._16_4_ = auVar104._16_4_ * fVar233;
  auVar97._20_4_ = auVar104._20_4_ * fVar240;
  auVar97._24_4_ = auVar104._24_4_ * fVar167;
  auVar97._28_4_ = auVar95._28_4_;
  auVar87 = vfmadd231ps_fma(auVar106,auVar105,auVar96);
  auVar82 = vfmadd231ps_fma(auVar93,auVar105,auVar101);
  auVar89 = vfmadd231ps_fma(auVar97,auVar105,auVar103);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar116,auVar98);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar116,auVar100);
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar116,auVar102);
  auVar98 = vandps_avx(ZEXT1632(auVar84),auVar112);
  auVar114._8_4_ = 0x219392ef;
  auVar114._0_8_ = 0x219392ef219392ef;
  auVar114._12_4_ = 0x219392ef;
  auVar114._16_4_ = 0x219392ef;
  auVar114._20_4_ = 0x219392ef;
  auVar114._24_4_ = 0x219392ef;
  auVar114._28_4_ = 0x219392ef;
  uVar81 = vcmpps_avx512vl(auVar98,auVar114,1);
  bVar6 = (bool)((byte)uVar81 & 1);
  auVar94._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar84._0_4_;
  bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar84._4_4_;
  bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar84._8_4_;
  bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar84._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar85),auVar112);
  uVar81 = vcmpps_avx512vl(auVar98,auVar114,1);
  bVar6 = (bool)((byte)uVar81 & 1);
  auVar108._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar85._0_4_;
  bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar108._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar85._4_4_;
  bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar108._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar85._8_4_;
  bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar108._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar85._12_4_;
  auVar108._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar108._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar108._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar108._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar86),auVar112);
  uVar81 = vcmpps_avx512vl(auVar98,auVar114,1);
  bVar6 = (bool)((byte)uVar81 & 1);
  auVar98._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar86._0_4_;
  bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar86._4_4_;
  bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar86._8_4_;
  bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar86._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar94);
  auVar113._8_4_ = 0x3f800000;
  auVar113._0_8_ = &DAT_3f8000003f800000;
  auVar113._12_4_ = 0x3f800000;
  auVar113._16_4_ = 0x3f800000;
  auVar113._20_4_ = 0x3f800000;
  auVar113._24_4_ = 0x3f800000;
  auVar113._28_4_ = 0x3f800000;
  auVar84 = vfnmadd213ps_fma(auVar94,auVar96,auVar113);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar108);
  auVar85 = vfnmadd213ps_fma(auVar108,auVar96,auVar113);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar98);
  auVar86 = vfnmadd213ps_fma(auVar98,auVar96,auVar113);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar96,auVar96);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 7 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar87));
  auVar102._4_4_ = auVar84._4_4_ * auVar98._4_4_;
  auVar102._0_4_ = auVar84._0_4_ * auVar98._0_4_;
  auVar102._8_4_ = auVar84._8_4_ * auVar98._8_4_;
  auVar102._12_4_ = auVar84._12_4_ * auVar98._12_4_;
  auVar102._16_4_ = auVar98._16_4_ * 0.0;
  auVar102._20_4_ = auVar98._20_4_ * 0.0;
  auVar102._24_4_ = auVar98._24_4_ * 0.0;
  auVar102._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 9 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar87));
  auVar97 = vpbroadcastd_avx512vl();
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar111._0_4_ = auVar84._0_4_ * auVar98._0_4_;
  auVar111._4_4_ = auVar84._4_4_ * auVar98._4_4_;
  auVar111._8_4_ = auVar84._8_4_ * auVar98._8_4_;
  auVar111._12_4_ = auVar84._12_4_ * auVar98._12_4_;
  auVar111._16_4_ = auVar98._16_4_ * 0.0;
  auVar111._20_4_ = auVar98._20_4_ * 0.0;
  auVar111._24_4_ = auVar98._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar74 * -2 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar82));
  auVar103._4_4_ = auVar85._4_4_ * auVar98._4_4_;
  auVar103._0_4_ = auVar85._0_4_ * auVar98._0_4_;
  auVar103._8_4_ = auVar85._8_4_ * auVar98._8_4_;
  auVar103._12_4_ = auVar85._12_4_ * auVar98._12_4_;
  auVar103._16_4_ = auVar98._16_4_ * 0.0;
  auVar103._20_4_ = auVar98._20_4_ * 0.0;
  auVar103._24_4_ = auVar98._24_4_ * 0.0;
  auVar103._28_4_ = auVar98._28_4_;
  auVar98 = vcvtdq2ps_avx(auVar96);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar82));
  auVar110._0_4_ = auVar85._0_4_ * auVar98._0_4_;
  auVar110._4_4_ = auVar85._4_4_ * auVar98._4_4_;
  auVar110._8_4_ = auVar85._8_4_ * auVar98._8_4_;
  auVar110._12_4_ = auVar85._12_4_ * auVar98._12_4_;
  auVar110._16_4_ = auVar98._16_4_ * 0.0;
  auVar110._20_4_ = auVar98._20_4_ * 0.0;
  auVar110._24_4_ = auVar98._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + uVar74 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar89));
  auVar104._4_4_ = auVar98._4_4_ * auVar86._4_4_;
  auVar104._0_4_ = auVar98._0_4_ * auVar86._0_4_;
  auVar104._8_4_ = auVar98._8_4_ * auVar86._8_4_;
  auVar104._12_4_ = auVar98._12_4_ * auVar86._12_4_;
  auVar104._16_4_ = auVar98._16_4_ * 0.0;
  auVar104._20_4_ = auVar98._20_4_ * 0.0;
  auVar104._24_4_ = auVar98._24_4_ * 0.0;
  auVar104._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x17 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar89));
  auVar109._0_4_ = auVar86._0_4_ * auVar98._0_4_;
  auVar109._4_4_ = auVar86._4_4_ * auVar98._4_4_;
  auVar109._8_4_ = auVar86._8_4_ * auVar98._8_4_;
  auVar109._12_4_ = auVar86._12_4_ * auVar98._12_4_;
  auVar109._16_4_ = auVar98._16_4_ * 0.0;
  auVar109._20_4_ = auVar98._20_4_ * 0.0;
  auVar109._24_4_ = auVar98._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar98 = vpminsd_avx2(auVar102,auVar111);
  auVar96 = vpminsd_avx2(auVar103,auVar110);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96 = vpminsd_avx2(auVar104,auVar109);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar99._4_4_ = uVar1;
  auVar99._0_4_ = uVar1;
  auVar99._8_4_ = uVar1;
  auVar99._12_4_ = uVar1;
  auVar99._16_4_ = uVar1;
  auVar99._20_4_ = uVar1;
  auVar99._24_4_ = uVar1;
  auVar99._28_4_ = uVar1;
  auVar96 = vmaxps_avx512vl(auVar96,auVar99);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar98,auVar96);
  auVar98 = vpmaxsd_avx2(auVar102,auVar111);
  auVar96 = vpmaxsd_avx2(auVar103,auVar110);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar96 = vpmaxsd_avx2(auVar104,auVar109);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar100._4_4_ = uVar1;
  auVar100._0_4_ = uVar1;
  auVar100._8_4_ = uVar1;
  auVar100._12_4_ = uVar1;
  auVar100._16_4_ = uVar1;
  auVar100._20_4_ = uVar1;
  auVar100._24_4_ = uVar1;
  auVar100._28_4_ = uVar1;
  auVar96 = vminps_avx512vl(auVar96,auVar100);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar101._8_4_ = 0x3f800003;
  auVar101._0_8_ = 0x3f8000033f800003;
  auVar101._12_4_ = 0x3f800003;
  auVar101._16_4_ = 0x3f800003;
  auVar101._20_4_ = 0x3f800003;
  auVar101._24_4_ = 0x3f800003;
  auVar101._28_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar101);
  uVar15 = vpcmpgtd_avx512vl(auVar97,_DAT_0205a920);
  uVar14 = vcmpps_avx512vl(local_420,auVar98,2);
  if ((byte)((byte)uVar14 & (byte)uVar15) == 0) {
    return;
  }
  local_808 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
  pPVar77 = prim + lVar79 + 0x16;
  local_610 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_828 = pPVar77;
  local_820 = prim;
LAB_01d06bd4:
  lVar79 = 0;
  for (uVar81 = local_808; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    lVar79 = lVar79 + 1;
  }
  local_808 = local_808 - 1 & local_808;
  uVar1 = *(undefined4 *)(prim + lVar79 * 4 + 6);
  uVar81 = (ulong)(uint)((int)lVar79 << 6);
  auVar84 = *(undefined1 (*) [16])(pPVar77 + uVar81);
  if (local_808 != 0) {
    uVar74 = local_808 - 1 & local_808;
    for (uVar73 = local_808; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
    }
    if (uVar74 != 0) {
      for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar85 = *(undefined1 (*) [16])(pPVar77 + uVar81 + 0x10);
  auVar86 = *(undefined1 (*) [16])(pPVar77 + uVar81 + 0x20);
  auVar87 = *(undefined1 (*) [16])(pPVar77 + uVar81 + 0x30);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar89 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_8a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar247 = ZEXT3264(local_8a0);
  local_8c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar248 = ZEXT3264(local_8c0);
  auVar82 = vunpcklps_avx512vl(local_8a0._0_16_,local_8c0._0_16_);
  local_800 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar246 = ZEXT3264(local_800);
  auVar90 = local_800._0_16_;
  local_780 = vinsertps_avx512f(auVar82,auVar90,0x28);
  auVar91._0_4_ = auVar84._0_4_ + auVar85._0_4_ + auVar86._0_4_ + auVar87._0_4_;
  auVar91._4_4_ = auVar84._4_4_ + auVar85._4_4_ + auVar86._4_4_ + auVar87._4_4_;
  auVar91._8_4_ = auVar84._8_4_ + auVar85._8_4_ + auVar86._8_4_ + auVar87._8_4_;
  auVar91._12_4_ = auVar84._12_4_ + auVar85._12_4_ + auVar86._12_4_ + auVar87._12_4_;
  auVar92._8_4_ = 0x3e800000;
  auVar92._0_8_ = 0x3e8000003e800000;
  auVar92._12_4_ = 0x3e800000;
  auVar82 = vmulps_avx512vl(auVar91,auVar92);
  auVar82 = vsubps_avx(auVar82,auVar89);
  auVar82 = vdpps_avx(auVar82,local_780,0x7f);
  fVar209 = *(float *)(ray + k * 4 + 0x30);
  local_790 = vdpps_avx(local_780,local_780,0x7f);
  uVar78 = *(uint *)(prim + 2);
  auVar225._4_12_ = ZEXT812(0) << 0x20;
  auVar225._0_4_ = local_790._0_4_;
  auVar83 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar225);
  auVar88 = vfnmadd213ss_fma(auVar83,local_790,ZEXT416(0x40000000));
  local_400 = auVar82._0_4_ * auVar83._0_4_ * auVar88._0_4_;
  auVar226._4_4_ = local_400;
  auVar226._0_4_ = local_400;
  auVar226._8_4_ = local_400;
  auVar226._12_4_ = local_400;
  fStack_650 = local_400;
  _local_660 = auVar226;
  fStack_64c = local_400;
  fStack_648 = local_400;
  fStack_644 = local_400;
  auVar82 = vfmadd231ps_fma(auVar89,local_780,auVar226);
  auVar82 = vblendps_avx(auVar82,ZEXT816(0) << 0x40,8);
  auVar84 = vsubps_avx(auVar84,auVar82);
  auVar86 = vsubps_avx(auVar86,auVar82);
  auVar85 = vsubps_avx(auVar85,auVar82);
  auVar87 = vsubps_avx(auVar87,auVar82);
  local_1e0 = auVar84._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  auVar119._8_4_ = 1;
  auVar119._0_8_ = 0x100000001;
  auVar119._12_4_ = 1;
  auVar119._16_4_ = 1;
  auVar119._20_4_ = 1;
  auVar119._24_4_ = 1;
  auVar119._28_4_ = 1;
  local_6a0 = ZEXT1632(auVar84);
  local_200 = vpermps_avx2(auVar119,local_6a0);
  auVar122._8_4_ = 2;
  auVar122._0_8_ = 0x200000002;
  auVar122._12_4_ = 2;
  auVar122._16_4_ = 2;
  auVar122._20_4_ = 2;
  auVar122._24_4_ = 2;
  auVar122._28_4_ = 2;
  local_220 = vpermps_avx2(auVar122,local_6a0);
  auVar123._8_4_ = 3;
  auVar123._0_8_ = 0x300000003;
  auVar123._12_4_ = 3;
  auVar123._16_4_ = 3;
  auVar123._20_4_ = 3;
  auVar123._24_4_ = 3;
  auVar123._28_4_ = 3;
  local_240 = vpermps_avx2(auVar123,local_6a0);
  local_260 = auVar85._0_4_;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_6e0 = ZEXT1632(auVar85);
  local_280 = vpermps_avx2(auVar119,local_6e0);
  local_2a0 = vpermps_avx2(auVar122,local_6e0);
  local_2c0 = vpermps_avx2(auVar123,local_6e0);
  local_2e0 = auVar86._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_6c0 = ZEXT1632(auVar86);
  local_300 = vpermps_avx2(auVar119,local_6c0);
  local_320 = vpermps_avx2(auVar122,local_6c0);
  local_340 = vpermps_avx2(auVar123,local_6c0);
  uVar210 = auVar87._0_4_;
  local_360._4_4_ = uVar210;
  local_360._0_4_ = uVar210;
  fStack_358 = (float)uVar210;
  fStack_354 = (float)uVar210;
  fStack_350 = (float)uVar210;
  fStack_34c = (float)uVar210;
  fStack_348 = (float)uVar210;
  register0x0000131c = uVar210;
  auVar221 = ZEXT3264(_local_360);
  _local_700 = ZEXT1632(auVar87);
  _local_380 = vpermps_avx2(auVar119,_local_700);
  _local_3a0 = vpermps_avx2(auVar122,_local_700);
  _local_3c0 = vpermps_avx2(auVar123,_local_700);
  auVar84 = vmulss_avx512f(auVar90,auVar90);
  auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),local_8c0,local_8c0);
  local_4a0 = vfmadd231ps_avx512vl(auVar98,local_8a0,local_8a0);
  local_3e0._0_4_ = local_4a0._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  auVar118._8_4_ = 0x7fffffff;
  auVar118._0_8_ = 0x7fffffff7fffffff;
  auVar118._12_4_ = 0x7fffffff;
  auVar118._16_4_ = 0x7fffffff;
  auVar118._20_4_ = 0x7fffffff;
  auVar118._24_4_ = 0x7fffffff;
  auVar118._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_3e0,auVar118);
  local_760 = ZEXT416((uint)local_400);
  local_400 = fVar209 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_5f0 = vpbroadcastd_avx512vl();
  local_818 = 1;
  local_810 = 0;
  local_600 = vpbroadcastd_avx512vl();
  auVar84 = vsqrtss_avx(local_790,local_790);
  local_8c4 = auVar84._0_4_;
  auVar84 = vsqrtss_avx(local_790,local_790);
  local_8c8 = auVar84._0_4_;
  auVar206 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar214 = ZEXT3264(_DAT_02020f20);
  do {
    local_840 = auVar206._0_16_;
    auVar84 = vmovshdup_avx(local_840);
    fVar146 = auVar206._0_4_;
    fVar167 = auVar84._0_4_ - fVar146;
    fVar240 = fVar167 * 0.04761905;
    auVar224._4_4_ = fVar146;
    auVar224._0_4_ = fVar146;
    auVar224._8_4_ = fVar146;
    auVar224._12_4_ = fVar146;
    auVar224._16_4_ = fVar146;
    auVar224._20_4_ = fVar146;
    auVar224._24_4_ = fVar146;
    auVar224._28_4_ = fVar146;
    local_7c0._4_4_ = fVar167;
    local_7c0._0_4_ = fVar167;
    local_7c0._8_4_ = fVar167;
    local_7c0._12_4_ = fVar167;
    local_7c0._16_4_ = fVar167;
    local_7c0._20_4_ = fVar167;
    local_7c0._24_4_ = fVar167;
    local_7c0._28_4_ = fVar167;
    auVar84 = vfmadd231ps_fma(auVar224,local_7c0,auVar214._0_32_);
    auVar155._8_4_ = 0x3f800000;
    auVar155._0_8_ = &DAT_3f8000003f800000;
    auVar155._12_4_ = 0x3f800000;
    auVar155._16_4_ = 0x3f800000;
    auVar155._20_4_ = 0x3f800000;
    auVar155._24_4_ = 0x3f800000;
    auVar155._28_4_ = 0x3f800000;
    auVar98 = vsubps_avx(auVar155,ZEXT1632(auVar84));
    auVar68._4_4_ = fStack_25c;
    auVar68._0_4_ = local_260;
    auVar68._8_4_ = fStack_258;
    auVar68._12_4_ = fStack_254;
    auVar68._16_4_ = fStack_250;
    auVar68._20_4_ = fStack_24c;
    auVar68._24_4_ = fStack_248;
    auVar68._28_4_ = fStack_244;
    fVar146 = auVar84._0_4_;
    auVar181._0_4_ = local_260 * fVar146;
    fVar230 = auVar84._4_4_;
    auVar181._4_4_ = fStack_25c * fVar230;
    fVar231 = auVar84._8_4_;
    auVar181._8_4_ = fStack_258 * fVar231;
    fVar233 = auVar84._12_4_;
    auVar181._12_4_ = fStack_254 * fVar233;
    auVar181._16_4_ = fStack_250 * 0.0;
    auVar181._20_4_ = fStack_24c * 0.0;
    auVar181._24_4_ = fStack_248 * 0.0;
    auVar181._28_4_ = 0;
    auVar207._0_4_ = local_280._0_4_ * fVar146;
    auVar207._4_4_ = local_280._4_4_ * fVar230;
    auVar207._8_4_ = local_280._8_4_ * fVar231;
    auVar207._12_4_ = local_280._12_4_ * fVar233;
    auVar207._16_4_ = local_280._16_4_ * 0.0;
    auVar207._20_4_ = local_280._20_4_ * 0.0;
    auVar207._28_36_ = auVar206._28_36_;
    auVar207._24_4_ = local_280._24_4_ * 0.0;
    auVar206._0_4_ = local_2a0._0_4_ * fVar146;
    auVar206._4_4_ = local_2a0._4_4_ * fVar230;
    auVar206._8_4_ = local_2a0._8_4_ * fVar231;
    auVar206._12_4_ = local_2a0._12_4_ * fVar233;
    auVar206._16_4_ = local_2a0._16_4_ * 0.0;
    auVar206._20_4_ = local_2a0._20_4_ * 0.0;
    auVar206._28_36_ = auVar214._28_36_;
    auVar206._24_4_ = local_2a0._24_4_ * 0.0;
    auVar214._0_4_ = local_2c0._0_4_ * fVar146;
    auVar214._4_4_ = local_2c0._4_4_ * fVar230;
    auVar214._8_4_ = local_2c0._8_4_ * fVar231;
    auVar214._12_4_ = local_2c0._12_4_ * fVar233;
    auVar214._16_4_ = local_2c0._16_4_ * 0.0;
    auVar214._20_4_ = local_2c0._20_4_ * 0.0;
    auVar214._28_36_ = auVar221._28_36_;
    auVar214._24_4_ = local_2c0._24_4_ * 0.0;
    auVar69._4_4_ = uStack_1dc;
    auVar69._0_4_ = local_1e0;
    auVar69._8_4_ = uStack_1d8;
    auVar69._12_4_ = uStack_1d4;
    auVar69._16_4_ = uStack_1d0;
    auVar69._20_4_ = uStack_1cc;
    auVar69._24_4_ = uStack_1c8;
    auVar69._28_4_ = uStack_1c4;
    auVar85 = vfmadd231ps_fma(auVar181,auVar98,auVar69);
    auVar86 = vfmadd231ps_fma(auVar207._0_32_,auVar98,local_200);
    auVar87 = vfmadd231ps_fma(auVar206._0_32_,auVar98,local_220);
    auVar82 = vfmadd231ps_fma(auVar214._0_32_,auVar98,local_240);
    auVar67._4_4_ = uStack_2dc;
    auVar67._0_4_ = local_2e0;
    auVar67._8_4_ = uStack_2d8;
    auVar67._12_4_ = uStack_2d4;
    auVar67._16_4_ = uStack_2d0;
    auVar67._20_4_ = uStack_2cc;
    auVar67._24_4_ = uStack_2c8;
    auVar67._28_4_ = uStack_2c4;
    auVar96 = vmulps_avx512vl(auVar67,ZEXT1632(auVar84));
    auVar104 = ZEXT1632(auVar84);
    auVar99 = vmulps_avx512vl(local_300,auVar104);
    auVar100 = vmulps_avx512vl(local_320,auVar104);
    auVar101 = vmulps_avx512vl(local_340,auVar104);
    auVar89 = vfmadd231ps_fma(auVar96,auVar98,auVar68);
    auVar88 = vfmadd231ps_fma(auVar99,auVar98,local_280);
    auVar83 = vfmadd231ps_fma(auVar100,auVar98,local_2a0);
    auVar90 = vfmadd231ps_fma(auVar101,auVar98,local_2c0);
    auVar38._4_4_ = fVar230 * (float)local_360._4_4_;
    auVar38._0_4_ = fVar146 * (float)local_360._0_4_;
    auVar38._8_4_ = fVar231 * fStack_358;
    auVar38._12_4_ = fVar233 * fStack_354;
    auVar38._16_4_ = fStack_350 * 0.0;
    auVar38._20_4_ = fStack_34c * 0.0;
    auVar38._24_4_ = fStack_348 * 0.0;
    auVar38._28_4_ = fStack_244;
    auVar39._4_4_ = fVar230 * (float)local_380._4_4_;
    auVar39._0_4_ = fVar146 * (float)local_380._0_4_;
    auVar39._8_4_ = fVar231 * fStack_378;
    auVar39._12_4_ = fVar233 * fStack_374;
    auVar39._16_4_ = fStack_370 * 0.0;
    auVar39._20_4_ = fStack_36c * 0.0;
    auVar39._24_4_ = fStack_368 * 0.0;
    auVar39._28_4_ = local_280._28_4_;
    auVar40._4_4_ = fVar230 * (float)local_3a0._4_4_;
    auVar40._0_4_ = fVar146 * (float)local_3a0._0_4_;
    auVar40._8_4_ = fVar231 * fStack_398;
    auVar40._12_4_ = fVar233 * fStack_394;
    auVar40._16_4_ = fStack_390 * 0.0;
    auVar40._20_4_ = fStack_38c * 0.0;
    auVar40._24_4_ = fStack_388 * 0.0;
    auVar40._28_4_ = local_2a0._28_4_;
    auVar41._4_4_ = fVar230 * (float)local_3c0._4_4_;
    auVar41._0_4_ = fVar146 * (float)local_3c0._0_4_;
    auVar41._8_4_ = fVar231 * fStack_3b8;
    auVar41._12_4_ = fVar233 * fStack_3b4;
    auVar41._16_4_ = fStack_3b0 * 0.0;
    auVar41._20_4_ = fStack_3ac * 0.0;
    auVar41._24_4_ = fStack_3a8 * 0.0;
    auVar41._28_4_ = local_2c0._28_4_;
    auVar96 = vfmadd231ps_avx512vl(auVar38,auVar98,auVar67);
    auVar99 = vfmadd231ps_avx512vl(auVar39,auVar98,local_300);
    auVar100 = vfmadd231ps_avx512vl(auVar40,auVar98,local_320);
    auVar101 = vfmadd231ps_avx512vl(auVar41,auVar98,local_340);
    auVar97 = vmulps_avx512vl(auVar104,ZEXT1632(auVar89));
    auVar102 = vmulps_avx512vl(auVar104,ZEXT1632(auVar88));
    auVar103 = vmulps_avx512vl(auVar104,ZEXT1632(auVar83));
    auVar104 = vmulps_avx512vl(auVar104,ZEXT1632(auVar90));
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar98,ZEXT1632(auVar85));
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,ZEXT1632(auVar86));
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar98,ZEXT1632(auVar87));
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar98,ZEXT1632(auVar82));
    auVar182._0_4_ = auVar96._0_4_ * fVar146;
    auVar182._4_4_ = auVar96._4_4_ * fVar230;
    auVar182._8_4_ = auVar96._8_4_ * fVar231;
    auVar182._12_4_ = auVar96._12_4_ * fVar233;
    auVar182._16_4_ = auVar96._16_4_ * 0.0;
    auVar182._20_4_ = auVar96._20_4_ * 0.0;
    auVar182._24_4_ = auVar96._24_4_ * 0.0;
    auVar182._28_4_ = 0;
    auVar42._4_4_ = auVar99._4_4_ * fVar230;
    auVar42._0_4_ = auVar99._0_4_ * fVar146;
    auVar42._8_4_ = auVar99._8_4_ * fVar231;
    auVar42._12_4_ = auVar99._12_4_ * fVar233;
    auVar42._16_4_ = auVar99._16_4_ * 0.0;
    auVar42._20_4_ = auVar99._20_4_ * 0.0;
    auVar42._24_4_ = auVar99._24_4_ * 0.0;
    auVar42._28_4_ = auVar96._28_4_;
    auVar43._4_4_ = auVar100._4_4_ * fVar230;
    auVar43._0_4_ = auVar100._0_4_ * fVar146;
    auVar43._8_4_ = auVar100._8_4_ * fVar231;
    auVar43._12_4_ = auVar100._12_4_ * fVar233;
    auVar43._16_4_ = auVar100._16_4_ * 0.0;
    auVar43._20_4_ = auVar100._20_4_ * 0.0;
    auVar43._24_4_ = auVar100._24_4_ * 0.0;
    auVar43._28_4_ = auVar99._28_4_;
    auVar44._4_4_ = auVar101._4_4_ * fVar230;
    auVar44._0_4_ = auVar101._0_4_ * fVar146;
    auVar44._8_4_ = auVar101._8_4_ * fVar231;
    auVar44._12_4_ = auVar101._12_4_ * fVar233;
    auVar44._16_4_ = auVar101._16_4_ * 0.0;
    auVar44._20_4_ = auVar101._20_4_ * 0.0;
    auVar44._24_4_ = auVar101._24_4_ * 0.0;
    auVar44._28_4_ = auVar100._28_4_;
    auVar85 = vfmadd231ps_fma(auVar182,auVar98,ZEXT1632(auVar89));
    auVar86 = vfmadd231ps_fma(auVar42,auVar98,ZEXT1632(auVar88));
    auVar87 = vfmadd231ps_fma(auVar43,auVar98,ZEXT1632(auVar83));
    auVar82 = vfmadd231ps_fma(auVar44,auVar98,ZEXT1632(auVar90));
    auVar96 = vmulps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar87));
    auVar101 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar233 * auVar85._12_4_,
                                             CONCAT48(fVar231 * auVar85._8_4_,
                                                      CONCAT44(fVar230 * auVar85._4_4_,
                                                               fVar146 * auVar85._0_4_)))),auVar98,
                          auVar97);
    auVar221 = ZEXT3264(auVar101);
    auVar105 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar86._12_4_ * fVar233,
                                             CONCAT48(auVar86._8_4_ * fVar231,
                                                      CONCAT44(auVar86._4_4_ * fVar230,
                                                               auVar86._0_4_ * fVar146)))),auVar98,
                          auVar102);
    auVar95 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar103);
    auVar99 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar82._12_4_ * fVar233,
                                            CONCAT48(auVar82._8_4_ * fVar231,
                                                     CONCAT44(auVar82._4_4_ * fVar230,
                                                              auVar82._0_4_ * fVar146)))),auVar104,
                         auVar98);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar85),auVar97);
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar86),auVar102);
    auVar100 = vsubps_avx512vl(ZEXT1632(auVar87),auVar103);
    auVar97 = vsubps_avx512vl(ZEXT1632(auVar82),auVar104);
    auVar242._0_4_ = fVar240 * auVar98._0_4_ * 3.0;
    auVar242._4_4_ = fVar240 * auVar98._4_4_ * 3.0;
    auVar242._8_4_ = fVar240 * auVar98._8_4_ * 3.0;
    auVar242._12_4_ = fVar240 * auVar98._12_4_ * 3.0;
    auVar242._16_4_ = fVar240 * auVar98._16_4_ * 3.0;
    auVar242._20_4_ = fVar240 * auVar98._20_4_ * 3.0;
    auVar242._24_4_ = fVar240 * auVar98._24_4_ * 3.0;
    auVar242._28_4_ = 0;
    auVar244._0_4_ = fVar240 * auVar96._0_4_ * 3.0;
    auVar244._4_4_ = fVar240 * auVar96._4_4_ * 3.0;
    auVar244._8_4_ = fVar240 * auVar96._8_4_ * 3.0;
    auVar244._12_4_ = fVar240 * auVar96._12_4_ * 3.0;
    auVar244._16_4_ = fVar240 * auVar96._16_4_ * 3.0;
    auVar244._20_4_ = fVar240 * auVar96._20_4_ * 3.0;
    auVar244._24_4_ = fVar240 * auVar96._24_4_ * 3.0;
    auVar244._28_4_ = 0;
    auVar245._0_4_ = auVar100._0_4_ * 3.0 * fVar240;
    auVar245._4_4_ = auVar100._4_4_ * 3.0 * fVar240;
    auVar245._8_4_ = auVar100._8_4_ * 3.0 * fVar240;
    auVar245._12_4_ = auVar100._12_4_ * 3.0 * fVar240;
    auVar245._16_4_ = auVar100._16_4_ * 3.0 * fVar240;
    auVar245._20_4_ = auVar100._20_4_ * 3.0 * fVar240;
    auVar245._24_4_ = auVar100._24_4_ * 3.0 * fVar240;
    auVar245._28_4_ = 0;
    fVar146 = auVar97._0_4_ * 3.0 * fVar240;
    fVar230 = auVar97._4_4_ * 3.0 * fVar240;
    auVar45._4_4_ = fVar230;
    auVar45._0_4_ = fVar146;
    fVar231 = auVar97._8_4_ * 3.0 * fVar240;
    auVar45._8_4_ = fVar231;
    fVar233 = auVar97._12_4_ * 3.0 * fVar240;
    auVar45._12_4_ = fVar233;
    fVar235 = auVar97._16_4_ * 3.0 * fVar240;
    auVar45._16_4_ = fVar235;
    fVar208 = auVar97._20_4_ * 3.0 * fVar240;
    auVar45._20_4_ = fVar208;
    fVar236 = auVar97._24_4_ * 3.0 * fVar240;
    auVar45._24_4_ = fVar236;
    auVar45._28_4_ = fVar240;
    auVar84 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar97 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,ZEXT1632(auVar84));
    auVar102 = vpermt2ps_avx512vl(auVar105,_DAT_0205fd20,ZEXT1632(auVar84));
    auVar100 = ZEXT1632(auVar84);
    auVar103 = vpermt2ps_avx512vl(auVar95,_DAT_0205fd20,auVar100);
    auVar183._0_4_ = auVar99._0_4_ + fVar146;
    auVar183._4_4_ = auVar99._4_4_ + fVar230;
    auVar183._8_4_ = auVar99._8_4_ + fVar231;
    auVar183._12_4_ = auVar99._12_4_ + fVar233;
    auVar183._16_4_ = auVar99._16_4_ + fVar235;
    auVar183._20_4_ = auVar99._20_4_ + fVar208;
    auVar183._24_4_ = auVar99._24_4_ + fVar236;
    auVar183._28_4_ = auVar99._28_4_ + fVar240;
    auVar98 = vmaxps_avx(auVar99,auVar183);
    auVar96 = vminps_avx(auVar99,auVar183);
    auVar104 = vpermt2ps_avx512vl(auVar99,_DAT_0205fd20,auVar100);
    auVar106 = vpermt2ps_avx512vl(auVar242,_DAT_0205fd20,auVar100);
    auVar107 = vpermt2ps_avx512vl(auVar244,_DAT_0205fd20,auVar100);
    auVar118 = ZEXT1632(auVar84);
    auVar93 = vpermt2ps_avx512vl(auVar245,_DAT_0205fd20,auVar118);
    auVar99 = vpermt2ps_avx512vl(auVar45,_DAT_0205fd20,auVar118);
    auVar94 = vsubps_avx512vl(auVar104,auVar99);
    auVar99 = vsubps_avx(auVar97,auVar101);
    auVar100 = vsubps_avx(auVar102,auVar105);
    auVar108 = vsubps_avx512vl(auVar103,auVar95);
    auVar109 = vmulps_avx512vl(auVar100,auVar245);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar244,auVar108);
    auVar110 = vmulps_avx512vl(auVar108,auVar242);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar245,auVar99);
    auVar111 = vmulps_avx512vl(auVar99,auVar244);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar242,auVar100);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar110 = vmulps_avx512vl(auVar108,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar100,auVar100);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar99,auVar99);
    auVar111 = vrcp14ps_avx512vl(auVar110);
    auVar112 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar155);
    auVar111 = vfmadd132ps_avx512vl(auVar112,auVar111,auVar111);
    auVar109 = vmulps_avx512vl(auVar109,auVar111);
    auVar112 = vmulps_avx512vl(auVar100,auVar93);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar107,auVar108);
    auVar113 = vmulps_avx512vl(auVar108,auVar106);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar93,auVar99);
    auVar114 = vmulps_avx512vl(auVar99,auVar107);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar106,auVar100);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar112,auVar111);
    auVar109 = vmaxps_avx512vl(auVar109,auVar111);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar111 = vmaxps_avx512vl(auVar94,auVar104);
    auVar98 = vmaxps_avx512vl(auVar98,auVar111);
    auVar111 = vaddps_avx512vl(auVar109,auVar98);
    auVar98 = vminps_avx512vl(auVar94,auVar104);
    auVar98 = vminps_avx(auVar96,auVar98);
    auVar98 = vsubps_avx512vl(auVar98,auVar109);
    auVar124._8_4_ = 0x3f800002;
    auVar124._0_8_ = 0x3f8000023f800002;
    auVar124._12_4_ = 0x3f800002;
    auVar124._16_4_ = 0x3f800002;
    auVar124._20_4_ = 0x3f800002;
    auVar124._24_4_ = 0x3f800002;
    auVar124._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar111,auVar124);
    auVar125._8_4_ = 0x3f7ffffc;
    auVar125._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar125._12_4_ = 0x3f7ffffc;
    auVar125._16_4_ = 0x3f7ffffc;
    auVar125._20_4_ = 0x3f7ffffc;
    auVar125._24_4_ = 0x3f7ffffc;
    auVar125._28_4_ = 0x3f7ffffc;
    local_7e0 = vmulps_avx512vl(auVar98,auVar125);
    auVar46._4_4_ = auVar96._4_4_ * auVar96._4_4_;
    auVar46._0_4_ = auVar96._0_4_ * auVar96._0_4_;
    auVar46._8_4_ = auVar96._8_4_ * auVar96._8_4_;
    auVar46._12_4_ = auVar96._12_4_ * auVar96._12_4_;
    auVar46._16_4_ = auVar96._16_4_ * auVar96._16_4_;
    auVar46._20_4_ = auVar96._20_4_ * auVar96._20_4_;
    auVar46._24_4_ = auVar96._24_4_ * auVar96._24_4_;
    auVar46._28_4_ = local_7e0._28_4_;
    auVar98 = vrsqrt14ps_avx512vl(auVar110);
    auVar24._8_4_ = 0xbf000000;
    auVar24._0_8_ = 0xbf000000bf000000;
    auVar24._12_4_ = 0xbf000000;
    auVar24._16_4_ = 0xbf000000;
    auVar24._20_4_ = 0xbf000000;
    auVar24._24_4_ = 0xbf000000;
    auVar24._28_4_ = 0xbf000000;
    auVar96 = vmulps_avx512vl(auVar110,auVar24);
    auVar47._4_4_ = auVar98._4_4_ * auVar96._4_4_;
    auVar47._0_4_ = auVar98._0_4_ * auVar96._0_4_;
    auVar47._8_4_ = auVar98._8_4_ * auVar96._8_4_;
    auVar47._12_4_ = auVar98._12_4_ * auVar96._12_4_;
    auVar47._16_4_ = auVar98._16_4_ * auVar96._16_4_;
    auVar47._20_4_ = auVar98._20_4_ * auVar96._20_4_;
    auVar47._24_4_ = auVar98._24_4_ * auVar96._24_4_;
    auVar47._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar98,auVar98);
    auVar96 = vmulps_avx512vl(auVar96,auVar47);
    auVar25._8_4_ = 0x3fc00000;
    auVar25._0_8_ = 0x3fc000003fc00000;
    auVar25._12_4_ = 0x3fc00000;
    auVar25._16_4_ = 0x3fc00000;
    auVar25._20_4_ = 0x3fc00000;
    auVar25._24_4_ = 0x3fc00000;
    auVar25._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar25);
    auVar48._4_4_ = auVar96._4_4_ * auVar99._4_4_;
    auVar48._0_4_ = auVar96._0_4_ * auVar99._0_4_;
    auVar48._8_4_ = auVar96._8_4_ * auVar99._8_4_;
    auVar48._12_4_ = auVar96._12_4_ * auVar99._12_4_;
    auVar48._16_4_ = auVar96._16_4_ * auVar99._16_4_;
    auVar48._20_4_ = auVar96._20_4_ * auVar99._20_4_;
    auVar48._24_4_ = auVar96._24_4_ * auVar99._24_4_;
    auVar48._28_4_ = auVar98._28_4_;
    auVar98 = vmulps_avx512vl(auVar100,auVar96);
    auVar104 = vmulps_avx512vl(auVar108,auVar96);
    auVar94 = vsubps_avx512vl(auVar118,auVar101);
    auVar109 = vsubps_avx512vl(auVar118,auVar105);
    auVar110 = vsubps_avx512vl(auVar118,auVar95);
    auVar111 = vmulps_avx512vl(auVar246._0_32_,auVar110);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar248._0_32_,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar247._0_32_,auVar94);
    auVar112 = vmulps_avx512vl(auVar110,auVar110);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,auVar109);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar94,auVar94);
    auVar113 = vmulps_avx512vl(auVar246._0_32_,auVar104);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar98,auVar248._0_32_);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar48,auVar247._0_32_);
    auVar104 = vmulps_avx512vl(auVar110,auVar104);
    auVar98 = vfmadd231ps_avx512vl(auVar104,auVar109,auVar98);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar48);
    local_640 = vmulps_avx512vl(auVar113,auVar113);
    auVar104 = vsubps_avx512vl(local_3e0,local_640);
    auVar114 = vmulps_avx512vl(auVar113,auVar98);
    auVar111 = vsubps_avx512vl(auVar111,auVar114);
    auVar111 = vaddps_avx512vl(auVar111,auVar111);
    auVar114 = vmulps_avx512vl(auVar98,auVar98);
    auVar112 = vsubps_avx512vl(auVar112,auVar114);
    auVar114 = vsubps_avx512vl(auVar112,auVar46);
    auVar115 = vmulps_avx512vl(auVar111,auVar111);
    auVar26._8_4_ = 0x40800000;
    auVar26._0_8_ = 0x4080000040800000;
    auVar26._12_4_ = 0x40800000;
    auVar26._16_4_ = 0x40800000;
    auVar26._20_4_ = 0x40800000;
    auVar26._24_4_ = 0x40800000;
    auVar26._28_4_ = 0x40800000;
    auVar116 = vmulps_avx512vl(auVar104,auVar26);
    auVar117 = vmulps_avx512vl(auVar116,auVar114);
    auVar117 = vsubps_avx512vl(auVar115,auVar117);
    auVar84 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
    uVar81 = vcmpps_avx512vl(auVar117,auVar118,5);
    bVar70 = (byte)uVar81;
    if (bVar70 == 0) {
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar117 = vsqrtps_avx512vl(auVar117);
      auVar118 = vaddps_avx512vl(auVar104,auVar104);
      auVar119 = vrcp14ps_avx512vl(auVar118);
      auVar118 = vfnmadd213ps_avx512vl(auVar118,auVar119,auVar155);
      auVar118 = vfmadd132ps_avx512vl(auVar118,auVar119,auVar119);
      auVar27._8_4_ = 0x80000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar27._12_4_ = 0x80000000;
      auVar27._16_4_ = 0x80000000;
      auVar27._20_4_ = 0x80000000;
      auVar27._24_4_ = 0x80000000;
      auVar27._28_4_ = 0x80000000;
      auVar119 = vxorps_avx512vl(auVar111,auVar27);
      auVar119 = vsubps_avx512vl(auVar119,auVar117);
      auVar119 = vmulps_avx512vl(auVar119,auVar118);
      auVar117 = vsubps_avx512vl(auVar117,auVar111);
      auVar117 = vmulps_avx512vl(auVar117,auVar118);
      auVar118 = vfmadd213ps_avx512vl(auVar113,auVar119,auVar98);
      local_4e0 = vmulps_avx512vl(auVar96,auVar118);
      auVar118 = vfmadd213ps_avx512vl(auVar113,auVar117,auVar98);
      local_500 = vmulps_avx512vl(auVar96,auVar118);
      auVar156._8_4_ = 0x7f800000;
      auVar156._0_8_ = 0x7f8000007f800000;
      auVar156._12_4_ = 0x7f800000;
      auVar156._16_4_ = 0x7f800000;
      auVar156._20_4_ = 0x7f800000;
      auVar156._24_4_ = 0x7f800000;
      auVar156._28_4_ = 0x7f800000;
      auVar118 = vblendmps_avx512vl(auVar156,auVar119);
      auVar120._0_4_ =
           (uint)(bVar70 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar70 & 1) * local_500._0_4_;
      bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * local_500._4_4_;
      bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * local_500._8_4_;
      bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar6 * auVar118._12_4_ | (uint)!bVar6 * local_500._12_4_;
      bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar6 * auVar118._16_4_ | (uint)!bVar6 * local_500._16_4_;
      bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar6 * auVar118._20_4_ | (uint)!bVar6 * local_500._20_4_;
      bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar6 * auVar118._24_4_ | (uint)!bVar6 * local_500._24_4_;
      bVar6 = SUB81(uVar81 >> 7,0);
      auVar120._28_4_ = (uint)bVar6 * auVar118._28_4_ | (uint)!bVar6 * local_500._28_4_;
      auVar157._8_4_ = 0xff800000;
      auVar157._0_8_ = 0xff800000ff800000;
      auVar157._12_4_ = 0xff800000;
      auVar157._16_4_ = 0xff800000;
      auVar157._20_4_ = 0xff800000;
      auVar157._24_4_ = 0xff800000;
      auVar157._28_4_ = 0xff800000;
      auVar118 = vblendmps_avx512vl(auVar157,auVar117);
      auVar121._0_4_ =
           (uint)(bVar70 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar117._0_4_;
      bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * auVar117._4_4_;
      bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * auVar117._8_4_;
      bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar6 * auVar118._12_4_ | (uint)!bVar6 * auVar117._12_4_;
      bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar6 * auVar118._16_4_ | (uint)!bVar6 * auVar117._16_4_;
      bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar6 * auVar118._20_4_ | (uint)!bVar6 * auVar117._20_4_;
      bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar6 * auVar118._24_4_ | (uint)!bVar6 * auVar117._24_4_;
      bVar6 = SUB81(uVar81 >> 7,0);
      auVar121._28_4_ = (uint)bVar6 * auVar118._28_4_ | (uint)!bVar6 * auVar117._28_4_;
      auVar158._8_4_ = 0x7fffffff;
      auVar158._0_8_ = 0x7fffffff7fffffff;
      auVar158._12_4_ = 0x7fffffff;
      auVar158._16_4_ = 0x7fffffff;
      auVar158._20_4_ = 0x7fffffff;
      auVar158._24_4_ = 0x7fffffff;
      auVar158._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_640,auVar158);
      auVar117 = vmaxps_avx512vl(local_4a0,local_640);
      auVar28._8_4_ = 0x36000000;
      auVar28._0_8_ = 0x3600000036000000;
      auVar28._12_4_ = 0x36000000;
      auVar28._16_4_ = 0x36000000;
      auVar28._20_4_ = 0x36000000;
      auVar28._24_4_ = 0x36000000;
      auVar28._28_4_ = 0x36000000;
      auVar118 = vmulps_avx512vl(auVar117,auVar28);
      auVar117 = vandps_avx(auVar104,auVar158);
      uVar73 = vcmpps_avx512vl(auVar117,auVar118,1);
      uVar81 = uVar81 & uVar73;
      bVar76 = (byte)uVar81;
      if (bVar76 != 0) {
        uVar73 = vcmpps_avx512vl(auVar114,ZEXT1632(auVar84),2);
        auVar189._8_4_ = 0xff800000;
        auVar189._0_8_ = 0xff800000ff800000;
        auVar189._12_4_ = 0xff800000;
        auVar189._16_4_ = 0xff800000;
        auVar189._20_4_ = 0xff800000;
        auVar189._24_4_ = 0xff800000;
        auVar189._28_4_ = 0xff800000;
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar118 = vblendmps_avx512vl(auVar114,auVar189);
        bVar72 = (byte)uVar73;
        uVar75 = (uint)(bVar72 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar117._0_4_;
        bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
        uVar139 = (uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * auVar117._4_4_;
        bVar6 = (bool)((byte)(uVar73 >> 2) & 1);
        uVar140 = (uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * auVar117._8_4_;
        bVar6 = (bool)((byte)(uVar73 >> 3) & 1);
        uVar141 = (uint)bVar6 * auVar118._12_4_ | (uint)!bVar6 * auVar117._12_4_;
        bVar6 = (bool)((byte)(uVar73 >> 4) & 1);
        uVar142 = (uint)bVar6 * auVar118._16_4_ | (uint)!bVar6 * auVar117._16_4_;
        bVar6 = (bool)((byte)(uVar73 >> 5) & 1);
        uVar143 = (uint)bVar6 * auVar118._20_4_ | (uint)!bVar6 * auVar117._20_4_;
        bVar6 = (bool)((byte)(uVar73 >> 6) & 1);
        uVar144 = (uint)bVar6 * auVar118._24_4_ | (uint)!bVar6 * auVar117._24_4_;
        bVar6 = SUB81(uVar73 >> 7,0);
        uVar145 = (uint)bVar6 * auVar118._28_4_ | (uint)!bVar6 * auVar117._28_4_;
        auVar120._0_4_ = (bVar76 & 1) * uVar75 | !(bool)(bVar76 & 1) * auVar120._0_4_;
        bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar120._4_4_ = bVar6 * uVar139 | !bVar6 * auVar120._4_4_;
        bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar120._8_4_ = bVar6 * uVar140 | !bVar6 * auVar120._8_4_;
        bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar120._12_4_ = bVar6 * uVar141 | !bVar6 * auVar120._12_4_;
        bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar120._16_4_ = bVar6 * uVar142 | !bVar6 * auVar120._16_4_;
        bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar120._20_4_ = bVar6 * uVar143 | !bVar6 * auVar120._20_4_;
        bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar120._24_4_ = bVar6 * uVar144 | !bVar6 * auVar120._24_4_;
        bVar6 = SUB81(uVar81 >> 7,0);
        auVar120._28_4_ = bVar6 * uVar145 | !bVar6 * auVar120._28_4_;
        auVar114 = vblendmps_avx512vl(auVar189,auVar114);
        bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar73 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar73 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
        bVar12 = SUB81(uVar73 >> 7,0);
        auVar121._0_4_ =
             (uint)(bVar76 & 1) *
             ((uint)(bVar72 & 1) * auVar114._0_4_ | !(bool)(bVar72 & 1) * uVar75) |
             !(bool)(bVar76 & 1) * auVar121._0_4_;
        bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar121._4_4_ =
             (uint)bVar80 * ((uint)bVar6 * auVar114._4_4_ | !bVar6 * uVar139) |
             !bVar80 * auVar121._4_4_;
        bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar121._8_4_ =
             (uint)bVar6 * ((uint)bVar7 * auVar114._8_4_ | !bVar7 * uVar140) |
             !bVar6 * auVar121._8_4_;
        bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar121._12_4_ =
             (uint)bVar6 * ((uint)bVar8 * auVar114._12_4_ | !bVar8 * uVar141) |
             !bVar6 * auVar121._12_4_;
        bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar121._16_4_ =
             (uint)bVar6 * ((uint)bVar9 * auVar114._16_4_ | !bVar9 * uVar142) |
             !bVar6 * auVar121._16_4_;
        bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar121._20_4_ =
             (uint)bVar6 * ((uint)bVar10 * auVar114._20_4_ | !bVar10 * uVar143) |
             !bVar6 * auVar121._20_4_;
        bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar121._24_4_ =
             (uint)bVar6 * ((uint)bVar11 * auVar114._24_4_ | !bVar11 * uVar144) |
             !bVar6 * auVar121._24_4_;
        bVar6 = SUB81(uVar81 >> 7,0);
        auVar121._28_4_ =
             (uint)bVar6 * ((uint)bVar12 * auVar114._28_4_ | !bVar12 * uVar145) |
             !bVar6 * auVar121._28_4_;
        bVar70 = (~bVar76 | bVar72) & bVar70;
      }
      auVar155._8_4_ = 0x3f800000;
      auVar155._0_8_ = &DAT_3f8000003f800000;
      auVar155._12_4_ = 0x3f800000;
      auVar155._16_4_ = 0x3f800000;
      auVar155._20_4_ = 0x3f800000;
      auVar155._24_4_ = 0x3f800000;
      auVar155._28_4_ = 0x3f800000;
    }
    in_ZMM31 = ZEXT3264(auVar121);
    if ((bVar70 & 0x7f) == 0) {
      auVar214 = ZEXT3264(_DAT_02020f20);
      auVar247 = ZEXT3264(local_8a0);
      auVar248 = ZEXT3264(local_8c0);
      auVar246 = ZEXT3264(local_800);
    }
    else {
      fVar146 = *(float *)(ray + k * 4 + 0x80) - (float)local_760._0_4_;
      auVar159._4_4_ = fVar146;
      auVar159._0_4_ = fVar146;
      auVar159._8_4_ = fVar146;
      auVar159._12_4_ = fVar146;
      auVar159._16_4_ = fVar146;
      auVar159._20_4_ = fVar146;
      auVar159._24_4_ = fVar146;
      auVar159._28_4_ = fVar146;
      auVar114 = vminps_avx512vl(auVar159,auVar121);
      auVar66._4_4_ = fStack_3fc;
      auVar66._0_4_ = local_400;
      auVar66._8_4_ = fStack_3f8;
      auVar66._12_4_ = fStack_3f4;
      auVar66._16_4_ = fStack_3f0;
      auVar66._20_4_ = fStack_3ec;
      auVar66._24_4_ = fStack_3e8;
      auVar66._28_4_ = fStack_3e4;
      auVar117 = vmaxps_avx512vl(auVar66,auVar120);
      auVar110 = vmulps_avx512vl(auVar110,auVar245);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar244,auVar110);
      auVar94 = vfmadd213ps_avx512vl(auVar94,auVar242,auVar109);
      auVar246 = ZEXT3264(local_800);
      auVar109 = vmulps_avx512vl(local_800,auVar245);
      auVar109 = vfmadd231ps_avx512vl(auVar109,local_8c0,auVar244);
      in_ZMM31 = ZEXT3264(local_8a0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,local_8a0,auVar242);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar109,auVar110);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar110,auVar118,1);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar94 = vxorps_avx512vl(auVar94,auVar119);
      auVar122 = vrcp14ps_avx512vl(auVar109);
      auVar123 = vxorps_avx512vl(auVar109,auVar119);
      auVar124 = vfnmadd213ps_avx512vl(auVar122,auVar109,auVar155);
      auVar124 = vfmadd132ps_avx512vl(auVar124,auVar122,auVar122);
      auVar124 = vmulps_avx512vl(auVar124,auVar94);
      uVar15 = vcmpps_avx512vl(auVar109,auVar123,1);
      bVar76 = (byte)uVar14 | (byte)uVar15;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar94 = vblendmps_avx512vl(auVar124,auVar125);
      auVar126._0_4_ =
           (uint)(bVar76 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar122._0_4_;
      bVar6 = (bool)(bVar76 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar6 * auVar94._4_4_ | (uint)!bVar6 * auVar122._4_4_;
      bVar6 = (bool)(bVar76 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar6 * auVar94._8_4_ | (uint)!bVar6 * auVar122._8_4_;
      bVar6 = (bool)(bVar76 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar6 * auVar94._12_4_ | (uint)!bVar6 * auVar122._12_4_;
      bVar6 = (bool)(bVar76 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar6 * auVar94._16_4_ | (uint)!bVar6 * auVar122._16_4_;
      bVar6 = (bool)(bVar76 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar6 * auVar94._20_4_ | (uint)!bVar6 * auVar122._20_4_;
      bVar6 = (bool)(bVar76 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar6 * auVar94._24_4_ | (uint)!bVar6 * auVar122._24_4_;
      auVar126._28_4_ =
           (uint)(bVar76 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar122._28_4_;
      auVar94 = vmaxps_avx(auVar117,auVar126);
      uVar15 = vcmpps_avx512vl(auVar109,auVar123,6);
      bVar76 = (byte)uVar14 | (byte)uVar15;
      auVar127._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * auVar124._0_4_;
      bVar6 = (bool)(bVar76 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar124._4_4_;
      bVar6 = (bool)(bVar76 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar124._8_4_;
      bVar6 = (bool)(bVar76 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar124._12_4_;
      bVar6 = (bool)(bVar76 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar124._16_4_;
      bVar6 = (bool)(bVar76 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar124._20_4_;
      bVar6 = (bool)(bVar76 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar124._24_4_;
      auVar127._28_4_ =
           (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar124._28_4_;
      auVar109 = vminps_avx(auVar114,auVar127);
      auVar84 = vxorps_avx512vl(auVar123._0_16_,auVar123._0_16_);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar84),auVar97);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar84),auVar102);
      auVar114 = ZEXT1632(auVar84);
      auVar103 = vsubps_avx512vl(auVar114,auVar103);
      auVar49._4_4_ = auVar103._4_4_ * auVar93._4_4_;
      auVar49._0_4_ = auVar103._0_4_ * auVar93._0_4_;
      auVar49._8_4_ = auVar103._8_4_ * auVar93._8_4_;
      auVar49._12_4_ = auVar103._12_4_ * auVar93._12_4_;
      auVar49._16_4_ = auVar103._16_4_ * auVar93._16_4_;
      auVar49._20_4_ = auVar103._20_4_ * auVar93._20_4_;
      auVar49._24_4_ = auVar103._24_4_ * auVar93._24_4_;
      auVar49._28_4_ = auVar103._28_4_;
      auVar102 = vfnmsub231ps_avx512vl(auVar49,auVar107,auVar102);
      auVar97 = vfnmadd231ps_avx512vl(auVar102,auVar106,auVar97);
      auVar102 = vmulps_avx512vl(local_800,auVar93);
      auVar102 = vfnmsub231ps_avx512vl(auVar102,local_8c0,auVar107);
      auVar102 = vfnmadd231ps_avx512vl(auVar102,local_8a0,auVar106);
      vandps_avx512vl(auVar102,auVar110);
      uVar14 = vcmpps_avx512vl(auVar102,auVar118,1);
      auVar97 = vxorps_avx512vl(auVar97,auVar119);
      auVar103 = vrcp14ps_avx512vl(auVar102);
      auVar106 = vxorps_avx512vl(auVar102,auVar119);
      auVar93 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar155);
      auVar84 = vfmadd132ps_fma(auVar93,auVar103,auVar103);
      fVar146 = auVar84._0_4_ * auVar97._0_4_;
      fVar230 = auVar84._4_4_ * auVar97._4_4_;
      auVar50._4_4_ = fVar230;
      auVar50._0_4_ = fVar146;
      fVar231 = auVar84._8_4_ * auVar97._8_4_;
      auVar50._8_4_ = fVar231;
      fVar233 = auVar84._12_4_ * auVar97._12_4_;
      auVar50._12_4_ = fVar233;
      fVar240 = auVar97._16_4_ * 0.0;
      auVar50._16_4_ = fVar240;
      fVar235 = auVar97._20_4_ * 0.0;
      auVar50._20_4_ = fVar235;
      fVar208 = auVar97._24_4_ * 0.0;
      auVar50._24_4_ = fVar208;
      auVar50._28_4_ = auVar97._28_4_;
      uVar15 = vcmpps_avx512vl(auVar102,auVar106,1);
      bVar76 = (byte)uVar14 | (byte)uVar15;
      auVar93 = vblendmps_avx512vl(auVar50,auVar125);
      auVar128._0_4_ =
           (uint)(bVar76 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar103._0_4_;
      bVar6 = (bool)(bVar76 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar6 * auVar93._4_4_ | (uint)!bVar6 * auVar103._4_4_;
      bVar6 = (bool)(bVar76 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar6 * auVar93._8_4_ | (uint)!bVar6 * auVar103._8_4_;
      bVar6 = (bool)(bVar76 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar6 * auVar93._12_4_ | (uint)!bVar6 * auVar103._12_4_;
      bVar6 = (bool)(bVar76 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar6 * auVar93._16_4_ | (uint)!bVar6 * auVar103._16_4_;
      bVar6 = (bool)(bVar76 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar6 * auVar93._20_4_ | (uint)!bVar6 * auVar103._20_4_;
      bVar6 = (bool)(bVar76 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar6 * auVar93._24_4_ | (uint)!bVar6 * auVar103._24_4_;
      auVar128._28_4_ =
           (uint)(bVar76 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar103._28_4_;
      _local_680 = vmaxps_avx(auVar94,auVar128);
      uVar15 = vcmpps_avx512vl(auVar102,auVar106,6);
      bVar76 = (byte)uVar14 | (byte)uVar15;
      auVar129._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * (int)fVar146;
      bVar6 = (bool)(bVar76 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar230;
      bVar6 = (bool)(bVar76 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar231;
      bVar6 = (bool)(bVar76 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar233;
      bVar6 = (bool)(bVar76 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar240;
      bVar6 = (bool)(bVar76 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar235;
      bVar6 = (bool)(bVar76 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar208;
      auVar129._28_4_ =
           (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar97._28_4_;
      local_460 = vminps_avx(auVar109,auVar129);
      uVar14 = vcmpps_avx512vl(_local_680,local_460,2);
      bVar70 = bVar70 & 0x7f & (byte)uVar14;
      if (bVar70 == 0) {
        auVar214 = ZEXT3264(_DAT_02020f20);
        auVar247 = ZEXT3264(local_8a0);
        auVar248 = ZEXT3264(local_8c0);
      }
      else {
        auVar103 = vmaxps_avx512vl(auVar114,local_7e0);
        auVar97 = vminps_avx512vl(local_4e0,auVar155);
        auVar56 = ZEXT412(0);
        auVar102 = ZEXT1232(auVar56) << 0x20;
        auVar97 = vmaxps_avx(auVar97,ZEXT1232(auVar56) << 0x20);
        auVar106 = vminps_avx512vl(local_500,auVar155);
        auVar51._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
        auVar51._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
        auVar51._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
        auVar51._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
        auVar51._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
        auVar51._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
        auVar51._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
        auVar51._28_4_ = auVar97._28_4_ + 7.0;
        auVar84 = vfmadd213ps_fma(auVar51,local_7c0,auVar224);
        local_4e0 = ZEXT1632(auVar84);
        auVar97 = vmaxps_avx(auVar106,ZEXT1232(auVar56) << 0x20);
        auVar52._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
        auVar52._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
        auVar52._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
        auVar52._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
        auVar52._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
        auVar52._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
        auVar52._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
        auVar52._28_4_ = auVar97._28_4_ + 7.0;
        auVar84 = vfmadd213ps_fma(auVar52,local_7c0,auVar224);
        local_500 = ZEXT1632(auVar84);
        auVar160._0_4_ = auVar103._0_4_ * auVar103._0_4_;
        auVar160._4_4_ = auVar103._4_4_ * auVar103._4_4_;
        auVar160._8_4_ = auVar103._8_4_ * auVar103._8_4_;
        auVar160._12_4_ = auVar103._12_4_ * auVar103._12_4_;
        auVar160._16_4_ = auVar103._16_4_ * auVar103._16_4_;
        auVar160._20_4_ = auVar103._20_4_ * auVar103._20_4_;
        auVar160._24_4_ = auVar103._24_4_ * auVar103._24_4_;
        auVar160._28_4_ = 0;
        auVar97 = vsubps_avx(auVar112,auVar160);
        auVar103 = vmulps_avx512vl(auVar116,auVar97);
        auVar103 = vsubps_avx512vl(auVar115,auVar103);
        uVar14 = vcmpps_avx512vl(auVar103,ZEXT1232(auVar56) << 0x20,5);
        bVar76 = (byte)uVar14;
        if (bVar76 == 0) {
          auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar106 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar107 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar130._8_4_ = 0x7f800000;
          auVar130._0_8_ = 0x7f8000007f800000;
          auVar130._12_4_ = 0x7f800000;
          auVar130._16_4_ = 0x7f800000;
          auVar130._20_4_ = 0x7f800000;
          auVar130._24_4_ = 0x7f800000;
          auVar130._28_4_ = 0x7f800000;
          auVar131._8_4_ = 0xff800000;
          auVar131._0_8_ = 0xff800000ff800000;
          auVar131._12_4_ = 0xff800000;
          auVar131._16_4_ = 0xff800000;
          auVar131._20_4_ = 0xff800000;
          auVar131._24_4_ = 0xff800000;
          auVar131._28_4_ = 0xff800000;
        }
        else {
          auVar85 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
          uVar81 = vcmpps_avx512vl(auVar103,auVar114,5);
          auVar102 = vsqrtps_avx(auVar103);
          auVar184._0_4_ = auVar104._0_4_ + auVar104._0_4_;
          auVar184._4_4_ = auVar104._4_4_ + auVar104._4_4_;
          auVar184._8_4_ = auVar104._8_4_ + auVar104._8_4_;
          auVar184._12_4_ = auVar104._12_4_ + auVar104._12_4_;
          auVar184._16_4_ = auVar104._16_4_ + auVar104._16_4_;
          auVar184._20_4_ = auVar104._20_4_ + auVar104._20_4_;
          auVar184._24_4_ = auVar104._24_4_ + auVar104._24_4_;
          auVar184._28_4_ = auVar104._28_4_ + auVar104._28_4_;
          auVar103 = vrcp14ps_avx512vl(auVar184);
          auVar106 = vfnmadd213ps_avx512vl(auVar184,auVar103,auVar155);
          auVar84 = vfmadd132ps_fma(auVar106,auVar103,auVar103);
          auVar29._8_4_ = 0x80000000;
          auVar29._0_8_ = 0x8000000080000000;
          auVar29._12_4_ = 0x80000000;
          auVar29._16_4_ = 0x80000000;
          auVar29._20_4_ = 0x80000000;
          auVar29._24_4_ = 0x80000000;
          auVar29._28_4_ = 0x80000000;
          auVar103 = vxorps_avx512vl(auVar111,auVar29);
          auVar103 = vsubps_avx(auVar103,auVar102);
          auVar53._4_4_ = auVar103._4_4_ * auVar84._4_4_;
          auVar53._0_4_ = auVar103._0_4_ * auVar84._0_4_;
          auVar53._8_4_ = auVar103._8_4_ * auVar84._8_4_;
          auVar53._12_4_ = auVar103._12_4_ * auVar84._12_4_;
          auVar53._16_4_ = auVar103._16_4_ * 0.0;
          auVar53._20_4_ = auVar103._20_4_ * 0.0;
          auVar53._24_4_ = auVar103._24_4_ * 0.0;
          auVar53._28_4_ = 0x3e000000;
          auVar102 = vsubps_avx512vl(auVar102,auVar111);
          auVar54._4_4_ = auVar102._4_4_ * auVar84._4_4_;
          auVar54._0_4_ = auVar102._0_4_ * auVar84._0_4_;
          auVar54._8_4_ = auVar102._8_4_ * auVar84._8_4_;
          auVar54._12_4_ = auVar102._12_4_ * auVar84._12_4_;
          auVar54._16_4_ = auVar102._16_4_ * 0.0;
          auVar54._20_4_ = auVar102._20_4_ * 0.0;
          auVar54._24_4_ = auVar102._24_4_ * 0.0;
          auVar54._28_4_ = fVar167;
          auVar102 = vfmadd213ps_avx512vl(auVar113,auVar53,auVar98);
          auVar55._4_4_ = auVar96._4_4_ * auVar102._4_4_;
          auVar55._0_4_ = auVar96._0_4_ * auVar102._0_4_;
          auVar55._8_4_ = auVar96._8_4_ * auVar102._8_4_;
          auVar55._12_4_ = auVar96._12_4_ * auVar102._12_4_;
          auVar55._16_4_ = auVar96._16_4_ * auVar102._16_4_;
          auVar55._20_4_ = auVar96._20_4_ * auVar102._20_4_;
          auVar55._24_4_ = auVar96._24_4_ * auVar102._24_4_;
          auVar55._28_4_ = auVar103._28_4_;
          auVar102 = vmulps_avx512vl(local_8a0,auVar53);
          auVar103 = vmulps_avx512vl(local_8c0,auVar53);
          auVar93 = vmulps_avx512vl(local_800,auVar53);
          auVar106 = vfmadd213ps_avx512vl(auVar99,auVar55,auVar101);
          auVar106 = vsubps_avx512vl(auVar102,auVar106);
          auVar102 = vfmadd213ps_avx512vl(auVar100,auVar55,auVar105);
          auVar107 = vsubps_avx512vl(auVar103,auVar102);
          auVar84 = vfmadd213ps_fma(auVar55,auVar108,auVar95);
          auVar103 = vsubps_avx(auVar93,ZEXT1632(auVar84));
          auVar98 = vfmadd213ps_avx512vl(auVar113,auVar54,auVar98);
          auVar96 = vmulps_avx512vl(auVar96,auVar98);
          auVar98 = vmulps_avx512vl(local_8a0,auVar54);
          auVar93 = vmulps_avx512vl(local_8c0,auVar54);
          auVar94 = vmulps_avx512vl(local_800,auVar54);
          auVar84 = vfmadd213ps_fma(auVar99,auVar96,auVar101);
          auVar102 = vsubps_avx(auVar98,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar100,auVar96,auVar105);
          auVar98 = vsubps_avx512vl(auVar93,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar108,auVar96,auVar95);
          auVar96 = vsubps_avx512vl(auVar94,ZEXT1632(auVar84));
          auVar202._8_4_ = 0x7f800000;
          auVar202._0_8_ = 0x7f8000007f800000;
          auVar202._12_4_ = 0x7f800000;
          auVar202._16_4_ = 0x7f800000;
          auVar202._20_4_ = 0x7f800000;
          auVar202._24_4_ = 0x7f800000;
          auVar202._28_4_ = 0x7f800000;
          auVar99 = vblendmps_avx512vl(auVar202,auVar53);
          bVar6 = (bool)((byte)uVar81 & 1);
          auVar130._0_4_ = (uint)bVar6 * auVar99._0_4_ | (uint)!bVar6 * auVar101._0_4_;
          bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar6 * auVar99._4_4_ | (uint)!bVar6 * auVar101._4_4_;
          bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar6 * auVar99._8_4_ | (uint)!bVar6 * auVar101._8_4_;
          bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar6 * auVar99._12_4_ | (uint)!bVar6 * auVar101._12_4_;
          bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar6 * auVar99._16_4_ | (uint)!bVar6 * auVar101._16_4_;
          bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar6 * auVar99._20_4_ | (uint)!bVar6 * auVar101._20_4_;
          bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar6 * auVar99._24_4_ | (uint)!bVar6 * auVar101._24_4_;
          bVar6 = SUB81(uVar81 >> 7,0);
          auVar130._28_4_ = (uint)bVar6 * auVar99._28_4_ | (uint)!bVar6 * auVar101._28_4_;
          auVar203._8_4_ = 0xff800000;
          auVar203._0_8_ = 0xff800000ff800000;
          auVar203._12_4_ = 0xff800000;
          auVar203._16_4_ = 0xff800000;
          auVar203._20_4_ = 0xff800000;
          auVar203._24_4_ = 0xff800000;
          auVar203._28_4_ = 0xff800000;
          auVar99 = vblendmps_avx512vl(auVar203,auVar54);
          bVar6 = (bool)((byte)uVar81 & 1);
          auVar131._0_4_ = (uint)bVar6 * auVar99._0_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar6 * auVar99._4_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar6 * auVar99._8_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar6 * auVar99._12_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar131._16_4_ = (uint)bVar6 * auVar99._16_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar131._20_4_ = (uint)bVar6 * auVar99._20_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar131._24_4_ = (uint)bVar6 * auVar99._24_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = SUB81(uVar81 >> 7,0);
          auVar131._28_4_ = (uint)bVar6 * auVar99._28_4_ | (uint)!bVar6 * -0x800000;
          auVar237._8_4_ = 0x7fffffff;
          auVar237._0_8_ = 0x7fffffff7fffffff;
          auVar237._12_4_ = 0x7fffffff;
          auVar237._16_4_ = 0x7fffffff;
          auVar237._20_4_ = 0x7fffffff;
          auVar237._24_4_ = 0x7fffffff;
          auVar237._28_4_ = 0x7fffffff;
          auVar99 = vandps_avx(auVar237,local_640);
          auVar99 = vmaxps_avx(local_4a0,auVar99);
          auVar30._8_4_ = 0x36000000;
          auVar30._0_8_ = 0x3600000036000000;
          auVar30._12_4_ = 0x36000000;
          auVar30._16_4_ = 0x36000000;
          auVar30._20_4_ = 0x36000000;
          auVar30._24_4_ = 0x36000000;
          auVar30._28_4_ = 0x36000000;
          auVar100 = vmulps_avx512vl(auVar99,auVar30);
          auVar99 = vandps_avx(auVar104,auVar237);
          uVar73 = vcmpps_avx512vl(auVar99,auVar100,1);
          uVar81 = uVar81 & uVar73;
          bVar72 = (byte)uVar81;
          if (bVar72 != 0) {
            uVar73 = vcmpps_avx512vl(auVar97,ZEXT1632(auVar85),2);
            auVar238._8_4_ = 0xff800000;
            auVar238._0_8_ = 0xff800000ff800000;
            auVar238._12_4_ = 0xff800000;
            auVar238._16_4_ = 0xff800000;
            auVar238._20_4_ = 0xff800000;
            auVar238._24_4_ = 0xff800000;
            auVar238._28_4_ = 0xff800000;
            auVar243._8_4_ = 0x7f800000;
            auVar243._0_8_ = 0x7f8000007f800000;
            auVar243._12_4_ = 0x7f800000;
            auVar243._16_4_ = 0x7f800000;
            auVar243._20_4_ = 0x7f800000;
            auVar243._24_4_ = 0x7f800000;
            auVar243._28_4_ = 0x7f800000;
            auVar99 = vblendmps_avx512vl(auVar243,auVar238);
            bVar71 = (byte)uVar73;
            uVar75 = (uint)(bVar71 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar100._0_4_
            ;
            bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
            uVar139 = (uint)bVar6 * auVar99._4_4_ | (uint)!bVar6 * auVar100._4_4_;
            bVar6 = (bool)((byte)(uVar73 >> 2) & 1);
            uVar140 = (uint)bVar6 * auVar99._8_4_ | (uint)!bVar6 * auVar100._8_4_;
            bVar6 = (bool)((byte)(uVar73 >> 3) & 1);
            uVar141 = (uint)bVar6 * auVar99._12_4_ | (uint)!bVar6 * auVar100._12_4_;
            bVar6 = (bool)((byte)(uVar73 >> 4) & 1);
            uVar142 = (uint)bVar6 * auVar99._16_4_ | (uint)!bVar6 * auVar100._16_4_;
            bVar6 = (bool)((byte)(uVar73 >> 5) & 1);
            uVar143 = (uint)bVar6 * auVar99._20_4_ | (uint)!bVar6 * auVar100._20_4_;
            bVar6 = (bool)((byte)(uVar73 >> 6) & 1);
            uVar144 = (uint)bVar6 * auVar99._24_4_ | (uint)!bVar6 * auVar100._24_4_;
            bVar6 = SUB81(uVar73 >> 7,0);
            uVar145 = (uint)bVar6 * auVar99._28_4_ | (uint)!bVar6 * auVar100._28_4_;
            auVar130._0_4_ = (bVar72 & 1) * uVar75 | !(bool)(bVar72 & 1) * auVar130._0_4_;
            bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar130._4_4_ = bVar6 * uVar139 | !bVar6 * auVar130._4_4_;
            bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar130._8_4_ = bVar6 * uVar140 | !bVar6 * auVar130._8_4_;
            bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar130._12_4_ = bVar6 * uVar141 | !bVar6 * auVar130._12_4_;
            bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar130._16_4_ = bVar6 * uVar142 | !bVar6 * auVar130._16_4_;
            bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar130._20_4_ = bVar6 * uVar143 | !bVar6 * auVar130._20_4_;
            bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar130._24_4_ = bVar6 * uVar144 | !bVar6 * auVar130._24_4_;
            bVar6 = SUB81(uVar81 >> 7,0);
            auVar130._28_4_ = bVar6 * uVar145 | !bVar6 * auVar130._28_4_;
            auVar99 = vblendmps_avx512vl(auVar238,auVar243);
            bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar73 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar73 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
            bVar12 = SUB81(uVar73 >> 7,0);
            auVar131._0_4_ =
                 (uint)(bVar72 & 1) *
                 ((uint)(bVar71 & 1) * auVar99._0_4_ | !(bool)(bVar71 & 1) * uVar75) |
                 !(bool)(bVar72 & 1) * auVar131._0_4_;
            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar131._4_4_ =
                 (uint)bVar80 * ((uint)bVar6 * auVar99._4_4_ | !bVar6 * uVar139) |
                 !bVar80 * auVar131._4_4_;
            bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar131._8_4_ =
                 (uint)bVar6 * ((uint)bVar7 * auVar99._8_4_ | !bVar7 * uVar140) |
                 !bVar6 * auVar131._8_4_;
            bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar131._12_4_ =
                 (uint)bVar6 * ((uint)bVar8 * auVar99._12_4_ | !bVar8 * uVar141) |
                 !bVar6 * auVar131._12_4_;
            bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar131._16_4_ =
                 (uint)bVar6 * ((uint)bVar9 * auVar99._16_4_ | !bVar9 * uVar142) |
                 !bVar6 * auVar131._16_4_;
            bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar131._20_4_ =
                 (uint)bVar6 * ((uint)bVar10 * auVar99._20_4_ | !bVar10 * uVar143) |
                 !bVar6 * auVar131._20_4_;
            bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar131._24_4_ =
                 (uint)bVar6 * ((uint)bVar11 * auVar99._24_4_ | !bVar11 * uVar144) |
                 !bVar6 * auVar131._24_4_;
            bVar6 = SUB81(uVar81 >> 7,0);
            auVar131._28_4_ =
                 (uint)bVar6 * ((uint)bVar12 * auVar99._28_4_ | !bVar12 * uVar145) |
                 !bVar6 * auVar131._28_4_;
            bVar76 = (~bVar72 | bVar71) & bVar76;
          }
        }
        auVar241._8_4_ = 0x7fffffff;
        auVar241._0_8_ = 0x7fffffff7fffffff;
        auVar241._12_4_ = 0x7fffffff;
        auVar248 = ZEXT3264(local_8c0);
        auVar247 = ZEXT3264(local_8a0);
        auVar96 = vmulps_avx512vl(local_800,auVar96);
        auVar98 = vfmadd231ps_avx512vl(auVar96,local_8c0,auVar98);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_8a0,auVar102);
        _local_1c0 = _local_680;
        local_1a0 = vminps_avx(local_460,auVar130);
        auVar229._8_4_ = 0x7fffffff;
        auVar229._0_8_ = 0x7fffffff7fffffff;
        auVar229._12_4_ = 0x7fffffff;
        auVar229._16_4_ = 0x7fffffff;
        auVar229._20_4_ = 0x7fffffff;
        auVar229._24_4_ = 0x7fffffff;
        auVar229._28_4_ = 0x7fffffff;
        auVar98 = vandps_avx(auVar98,auVar229);
        auVar221 = ZEXT3264(auVar98);
        _local_480 = vmaxps_avx(_local_680,auVar131);
        auVar204._8_4_ = 0x3e99999a;
        auVar204._0_8_ = 0x3e99999a3e99999a;
        auVar204._12_4_ = 0x3e99999a;
        auVar204._16_4_ = 0x3e99999a;
        auVar204._20_4_ = 0x3e99999a;
        auVar204._24_4_ = 0x3e99999a;
        auVar204._28_4_ = 0x3e99999a;
        uVar14 = vcmpps_avx512vl(auVar98,auVar204,1);
        local_8cc = (undefined4)uVar14;
        uVar14 = vcmpps_avx512vl(_local_680,local_1a0,2);
        bVar72 = (byte)uVar14 & bVar70;
        _local_540 = _local_480;
        uVar15 = vcmpps_avx512vl(_local_480,local_460,2);
        if ((bVar70 & ((byte)uVar15 | (byte)uVar14)) == 0) {
          auVar214 = ZEXT3264(_DAT_02020f20);
        }
        else {
          auVar98 = vmulps_avx512vl(local_800,auVar103);
          auVar98 = vfmadd213ps_avx512vl(auVar107,local_8c0,auVar98);
          auVar98 = vfmadd213ps_avx512vl(auVar106,local_8a0,auVar98);
          auVar98 = vandps_avx(auVar98,auVar229);
          uVar14 = vcmpps_avx512vl(auVar98,auVar204,1);
          local_8d4 = (uint)(byte)~bVar76;
          bVar76 = (byte)uVar14 | ~bVar76;
          auVar161._8_4_ = 2;
          auVar161._0_8_ = 0x200000002;
          auVar161._12_4_ = 2;
          auVar161._16_4_ = 2;
          auVar161._20_4_ = 2;
          auVar161._24_4_ = 2;
          auVar161._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar98 = vpblendmd_avx512vl(auVar161,auVar31);
          local_440._0_4_ = (uint)(bVar76 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar76 & 1) * 2;
          bVar6 = (bool)(bVar76 >> 1 & 1);
          local_440._4_4_ = (uint)bVar6 * auVar98._4_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar76 >> 2 & 1);
          local_440._8_4_ = (uint)bVar6 * auVar98._8_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar76 >> 3 & 1);
          local_440._12_4_ = (uint)bVar6 * auVar98._12_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar76 >> 4 & 1);
          local_440._16_4_ = (uint)bVar6 * auVar98._16_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar76 >> 5 & 1);
          local_440._20_4_ = (uint)bVar6 * auVar98._20_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar76 >> 6 & 1);
          local_440._24_4_ = (uint)bVar6 * auVar98._24_4_ | (uint)!bVar6 * 2;
          local_440._28_4_ = (uint)(bVar76 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar76 >> 7) * 2;
          local_4c0 = vpbroadcastd_avx512vl();
          uVar14 = vpcmpd_avx512vl(local_4c0,local_440,5);
          local_8d0 = (uint)bVar72;
          bVar72 = (byte)uVar14 & bVar72;
          if (bVar72 != 0) {
            auVar85 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar84 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar86 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
            auVar87 = vminps_avx(auVar85,auVar86);
            auVar85 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
            auVar86 = vmaxps_avx(auVar84,auVar85);
            auVar84 = vandps_avx(auVar241,auVar87);
            auVar85 = vandps_avx(auVar241,auVar86);
            auVar84 = vmaxps_avx(auVar84,auVar85);
            auVar85 = vmovshdup_avx(auVar84);
            auVar85 = vmaxss_avx(auVar85,auVar84);
            auVar84 = vshufpd_avx(auVar84,auVar84,1);
            auVar84 = vmaxss_avx(auVar84,auVar85);
            fVar146 = auVar84._0_4_ * 1.9073486e-06;
            local_770 = vshufps_avx(auVar86,auVar86,0xff);
            local_520 = (float)local_680._0_4_ + (float)local_660._0_4_;
            fStack_51c = (float)local_680._4_4_ + (float)local_660._4_4_;
            fStack_518 = fStack_678 + fStack_658;
            fStack_514 = fStack_674 + fStack_654;
            fStack_510 = fStack_670 + fStack_650;
            fStack_50c = fStack_66c + fStack_64c;
            fStack_508 = fStack_668 + fStack_648;
            fStack_504 = fStack_664 + fStack_644;
            do {
              auVar162._8_4_ = 0x7f800000;
              auVar162._0_8_ = 0x7f8000007f800000;
              auVar162._12_4_ = 0x7f800000;
              auVar162._16_4_ = 0x7f800000;
              auVar162._20_4_ = 0x7f800000;
              auVar162._24_4_ = 0x7f800000;
              auVar162._28_4_ = 0x7f800000;
              auVar98 = vblendmps_avx512vl(auVar162,_local_680);
              auVar132._0_4_ =
                   (uint)(bVar72 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar72 & 1) * 0x7f800000;
              bVar6 = (bool)(bVar72 >> 1 & 1);
              auVar132._4_4_ = (uint)bVar6 * auVar98._4_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar72 >> 2 & 1);
              auVar132._8_4_ = (uint)bVar6 * auVar98._8_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar72 >> 3 & 1);
              auVar132._12_4_ = (uint)bVar6 * auVar98._12_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar72 >> 4 & 1);
              auVar132._16_4_ = (uint)bVar6 * auVar98._16_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar72 >> 5 & 1);
              auVar132._20_4_ = (uint)bVar6 * auVar98._20_4_ | (uint)!bVar6 * 0x7f800000;
              auVar132._24_4_ =
                   (uint)(bVar72 >> 6) * auVar98._24_4_ | (uint)!(bool)(bVar72 >> 6) * 0x7f800000;
              auVar132._28_4_ = 0x7f800000;
              auVar98 = vshufps_avx(auVar132,auVar132,0xb1);
              auVar98 = vminps_avx(auVar132,auVar98);
              auVar96 = vshufpd_avx(auVar98,auVar98,5);
              auVar98 = vminps_avx(auVar98,auVar96);
              auVar96 = vpermpd_avx2(auVar98,0x4e);
              auVar98 = vminps_avx(auVar98,auVar96);
              uVar14 = vcmpps_avx512vl(auVar132,auVar98,0);
              bVar71 = (byte)uVar14 & bVar72;
              bVar76 = bVar72;
              if (bVar71 != 0) {
                bVar76 = bVar71;
              }
              iVar17 = 0;
              for (uVar75 = (uint)bVar76; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              fVar230 = *(float *)(local_4e0 + (uint)(iVar17 << 2));
              fVar231 = *(float *)(local_1c0 + (uint)(iVar17 << 2));
              fVar233 = local_8c8;
              if ((float)local_790._0_4_ < 0.0) {
                fVar233 = sqrtf((float)local_790._0_4_);
              }
              lVar79 = 4;
              do {
                auVar147._4_4_ = fVar231;
                auVar147._0_4_ = fVar231;
                auVar147._8_4_ = fVar231;
                auVar147._12_4_ = fVar231;
                auVar85 = vfmadd132ps_fma(auVar147,ZEXT816(0) << 0x40,local_780);
                fVar240 = 1.0 - fVar230;
                auVar190._0_4_ = local_6e0._0_4_ * fVar230;
                auVar190._4_4_ = local_6e0._4_4_ * fVar230;
                auVar190._8_4_ = local_6e0._8_4_ * fVar230;
                auVar190._12_4_ = local_6e0._12_4_ * fVar230;
                local_710 = ZEXT416((uint)fVar240);
                auVar211._4_4_ = fVar240;
                auVar211._0_4_ = fVar240;
                auVar211._8_4_ = fVar240;
                auVar211._12_4_ = fVar240;
                auVar84 = vfmadd231ps_fma(auVar190,auVar211,local_6a0._0_16_);
                auVar215._0_4_ = local_6c0._0_4_ * fVar230;
                auVar215._4_4_ = local_6c0._4_4_ * fVar230;
                auVar215._8_4_ = local_6c0._8_4_ * fVar230;
                auVar215._12_4_ = local_6c0._12_4_ * fVar230;
                auVar86 = vfmadd231ps_fma(auVar215,auVar211,local_6e0._0_16_);
                auVar222._0_4_ = fVar230 * (float)local_700._0_4_;
                auVar222._4_4_ = fVar230 * (float)local_700._4_4_;
                auVar222._8_4_ = fVar230 * fStack_6f8;
                auVar222._12_4_ = fVar230 * fStack_6f4;
                auVar87 = vfmadd231ps_fma(auVar222,auVar211,local_6c0._0_16_);
                auVar227._0_4_ = fVar230 * auVar86._0_4_;
                auVar227._4_4_ = fVar230 * auVar86._4_4_;
                auVar227._8_4_ = fVar230 * auVar86._8_4_;
                auVar227._12_4_ = fVar230 * auVar86._12_4_;
                auVar84 = vfmadd231ps_fma(auVar227,auVar211,auVar84);
                auVar191._0_4_ = fVar230 * auVar87._0_4_;
                auVar191._4_4_ = fVar230 * auVar87._4_4_;
                auVar191._8_4_ = fVar230 * auVar87._8_4_;
                auVar191._12_4_ = fVar230 * auVar87._12_4_;
                auVar86 = vfmadd231ps_fma(auVar191,auVar211,auVar86);
                auVar216._0_4_ = fVar230 * auVar86._0_4_;
                auVar216._4_4_ = fVar230 * auVar86._4_4_;
                auVar216._8_4_ = fVar230 * auVar86._8_4_;
                auVar216._12_4_ = fVar230 * auVar86._12_4_;
                auVar87 = vfmadd231ps_fma(auVar216,auVar84,auVar211);
                auVar84 = vsubps_avx(auVar86,auVar84);
                auVar18._8_4_ = 0x40400000;
                auVar18._0_8_ = 0x4040000040400000;
                auVar18._12_4_ = 0x40400000;
                auVar86 = vmulps_avx512vl(auVar84,auVar18);
                local_640._0_16_ = auVar87;
                auVar84 = vsubps_avx(auVar85,auVar87);
                local_7c0._0_16_ = auVar84;
                auVar84 = vdpps_avx(auVar84,auVar84,0x7f);
                local_7e0._0_16_ = auVar84;
                local_940 = ZEXT416((uint)fVar230);
                if (auVar84._0_4_ < 0.0) {
                  auVar221._0_4_ = sqrtf(auVar84._0_4_);
                  auVar221._4_60_ = extraout_var;
                  auVar84 = auVar221._0_16_;
                }
                else {
                  auVar84 = vsqrtss_avx(auVar84,auVar84);
                }
                local_720 = vdpps_avx(auVar86,auVar86,0x7f);
                fVar240 = local_720._0_4_;
                auVar192._4_12_ = ZEXT812(0) << 0x20;
                auVar192._0_4_ = fVar240;
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
                fVar167 = auVar85._0_4_;
                local_730 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar87 = vxorps_avx512vl(local_720,auVar19);
                auVar85 = vfnmadd213ss_fma(local_730,local_720,ZEXT416(0x40000000));
                uVar75 = auVar84._0_4_;
                if (fVar240 < auVar87._0_4_) {
                  auVar246._0_4_ = sqrtf(fVar240);
                  auVar246._4_60_ = extraout_var_00;
                  auVar84 = ZEXT416(uVar75);
                  auVar87 = auVar246._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx512f(local_720,local_720);
                }
                fVar240 = fVar167 * 1.5 + fVar240 * -0.5 * fVar167 * fVar167 * fVar167;
                auVar148._0_4_ = auVar86._0_4_ * fVar240;
                auVar148._4_4_ = auVar86._4_4_ * fVar240;
                auVar148._8_4_ = auVar86._8_4_ * fVar240;
                auVar148._12_4_ = auVar86._12_4_ * fVar240;
                auVar82 = vdpps_avx(local_7c0._0_16_,auVar148,0x7f);
                fVar208 = auVar84._0_4_;
                fVar167 = auVar82._0_4_;
                auVar149._0_4_ = fVar167 * fVar167;
                auVar149._4_4_ = auVar82._4_4_ * auVar82._4_4_;
                auVar149._8_4_ = auVar82._8_4_ * auVar82._8_4_;
                auVar149._12_4_ = auVar82._12_4_ * auVar82._12_4_;
                auVar88 = vsubps_avx512vl(local_7e0._0_16_,auVar149);
                fVar235 = auVar88._0_4_;
                auVar169._4_12_ = ZEXT812(0) << 0x20;
                auVar169._0_4_ = fVar235;
                auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
                auVar83 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
                auVar90 = vmulss_avx512f(auVar88,ZEXT416(0xbf000000));
                if (fVar235 < 0.0) {
                  local_750 = fVar240;
                  fStack_74c = fVar240;
                  fStack_748 = fVar240;
                  fStack_744 = fVar240;
                  local_740 = auVar89;
                  fVar235 = sqrtf(fVar235);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar83 = ZEXT416(auVar83._0_4_);
                  auVar87 = ZEXT416(auVar87._0_4_);
                  auVar84 = ZEXT416(uVar75);
                  auVar89 = local_740;
                  fVar240 = local_750;
                  fVar236 = fStack_74c;
                  fVar232 = fStack_748;
                  fVar234 = fStack_744;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  fVar235 = auVar88._0_4_;
                  fVar236 = fVar240;
                  fVar232 = fVar240;
                  fVar234 = fVar240;
                }
                auVar241._8_4_ = 0x7fffffff;
                auVar241._0_8_ = 0x7fffffff7fffffff;
                auVar241._12_4_ = 0x7fffffff;
                auVar247 = ZEXT3264(local_8a0);
                auVar248 = ZEXT3264(local_8c0);
                auVar246 = ZEXT3264(local_800);
                auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_940,local_710);
                fVar168 = auVar88._0_4_ * 6.0;
                fVar13 = fVar230 * 6.0;
                auVar193._0_4_ = fVar13 * (float)local_700._0_4_;
                auVar193._4_4_ = fVar13 * (float)local_700._4_4_;
                auVar193._8_4_ = fVar13 * fStack_6f8;
                auVar193._12_4_ = fVar13 * fStack_6f4;
                auVar170._4_4_ = fVar168;
                auVar170._0_4_ = fVar168;
                auVar170._8_4_ = fVar168;
                auVar170._12_4_ = fVar168;
                auVar88 = vfmadd132ps_fma(auVar170,auVar193,local_6c0._0_16_);
                auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_710,local_940);
                fVar168 = auVar92._0_4_ * 6.0;
                auVar194._4_4_ = fVar168;
                auVar194._0_4_ = fVar168;
                auVar194._8_4_ = fVar168;
                auVar194._12_4_ = fVar168;
                auVar88 = vfmadd132ps_fma(auVar194,auVar88,local_6e0._0_16_);
                fVar168 = local_710._0_4_ * 6.0;
                auVar171._4_4_ = fVar168;
                auVar171._0_4_ = fVar168;
                auVar171._8_4_ = fVar168;
                auVar171._12_4_ = fVar168;
                auVar88 = vfmadd132ps_fma(auVar171,auVar88,local_6a0._0_16_);
                auVar195._0_4_ = auVar88._0_4_ * (float)local_720._0_4_;
                auVar195._4_4_ = auVar88._4_4_ * (float)local_720._0_4_;
                auVar195._8_4_ = auVar88._8_4_ * (float)local_720._0_4_;
                auVar195._12_4_ = auVar88._12_4_ * (float)local_720._0_4_;
                auVar88 = vdpps_avx(auVar86,auVar88,0x7f);
                fVar168 = auVar88._0_4_;
                auVar172._0_4_ = auVar86._0_4_ * fVar168;
                auVar172._4_4_ = auVar86._4_4_ * fVar168;
                auVar172._8_4_ = auVar86._8_4_ * fVar168;
                auVar172._12_4_ = auVar86._12_4_ * fVar168;
                auVar88 = vsubps_avx(auVar195,auVar172);
                fVar168 = auVar85._0_4_ * (float)local_730._0_4_;
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar134._16_16_ = local_800._16_16_;
                auVar91 = vxorps_avx512vl(auVar86,auVar20);
                auVar217._0_4_ = fVar240 * auVar88._0_4_ * fVar168;
                auVar217._4_4_ = fVar236 * auVar88._4_4_ * fVar168;
                auVar217._8_4_ = fVar232 * auVar88._8_4_ * fVar168;
                auVar217._12_4_ = fVar234 * auVar88._12_4_ * fVar168;
                auVar85 = vdpps_avx(auVar91,auVar148,0x7f);
                auVar88 = vmaxss_avx(ZEXT416((uint)fVar146),
                                     ZEXT416((uint)(fVar231 * fVar233 * 1.9073486e-06)));
                auVar92 = vdivss_avx512f(ZEXT416((uint)fVar146),auVar87);
                auVar87 = vdpps_avx(local_7c0._0_16_,auVar217,0x7f);
                auVar84 = vfmadd213ss_fma(auVar84,ZEXT416((uint)fVar146),auVar88);
                auVar92 = vfmadd213ss_fma(ZEXT416((uint)(fVar208 + 1.0)),auVar92,auVar84);
                auVar84 = vdpps_avx(local_780,auVar148,0x7f);
                fVar240 = auVar85._0_4_ + auVar87._0_4_;
                auVar85 = vdpps_avx(local_7c0._0_16_,auVar91,0x7f);
                auVar90 = vmulss_avx512f(auVar90,auVar89);
                auVar89 = vmulss_avx512f(auVar89,auVar89);
                auVar87 = vdpps_avx(local_7c0._0_16_,local_780,0x7f);
                auVar90 = vaddss_avx512f(auVar83,ZEXT416((uint)(auVar90._0_4_ * auVar89._0_4_)));
                auVar89 = vfnmadd231ss_fma(auVar85,auVar82,ZEXT416((uint)fVar240));
                auVar83 = vfnmadd231ss_fma(auVar87,auVar82,auVar84);
                auVar85 = vpermilps_avx(local_640._0_16_,0xff);
                fVar235 = fVar235 - auVar85._0_4_;
                auVar85 = vshufps_avx(auVar86,auVar86,0xff);
                auVar87 = vfmsub213ss_fma(auVar89,auVar90,auVar85);
                fVar208 = auVar83._0_4_ * auVar90._0_4_;
                auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar87._0_4_)),
                                          ZEXT416((uint)fVar240),ZEXT416((uint)fVar208));
                fVar236 = auVar89._0_4_;
                fVar240 = fVar235 * (fVar240 / fVar236) - fVar167 * (auVar87._0_4_ / fVar236);
                auVar221 = ZEXT464((uint)fVar240);
                fVar230 = fVar230 - (fVar167 * (fVar208 / fVar236) -
                                    fVar235 * (auVar84._0_4_ / fVar236));
                fVar231 = fVar231 - fVar240;
                auVar84 = vandps_avx(auVar82,auVar241);
                if (auVar92._0_4_ <= auVar84._0_4_) {
LAB_01d08182:
                  bVar6 = false;
                }
                else {
                  auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar92._0_4_ + auVar88._0_4_)),local_770
                                            ,ZEXT416(0x36000000));
                  auVar84 = vandps_avx(auVar241,ZEXT416((uint)fVar235));
                  if (auVar87._0_4_ <= auVar84._0_4_) goto LAB_01d08182;
                  fVar231 = fVar231 + (float)local_760._0_4_;
                  bVar6 = true;
                  if (fVar209 <= fVar231) {
                    fVar240 = *(float *)(ray + k * 4 + 0x80);
                    auVar221 = ZEXT464((uint)fVar240);
                    if (((fVar231 <= fVar240) && (0.0 <= fVar230)) && (fVar230 <= 1.0)) {
                      auVar134._0_16_ = ZEXT816(0) << 0x20;
                      auVar133._4_28_ = auVar134._4_28_;
                      auVar133._0_4_ = local_7e0._0_4_;
                      auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar133._0_16_);
                      fVar167 = auVar84._0_4_;
                      auVar84 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                      pGVar4 = (context->scene->geometries).items[uVar78].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        fVar167 = fVar167 * 1.5 + auVar84._0_4_ * fVar167 * fVar167 * fVar167;
                        auVar173._0_4_ = local_7c0._0_4_ * fVar167;
                        auVar173._4_4_ = local_7c0._4_4_ * fVar167;
                        auVar173._8_4_ = local_7c0._8_4_ * fVar167;
                        auVar173._12_4_ = local_7c0._12_4_ * fVar167;
                        auVar87 = vfmadd213ps_fma(auVar85,auVar173,auVar86);
                        auVar84 = vshufps_avx(auVar173,auVar173,0xc9);
                        auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                        auVar174._0_4_ = auVar173._0_4_ * auVar85._0_4_;
                        auVar174._4_4_ = auVar173._4_4_ * auVar85._4_4_;
                        auVar174._8_4_ = auVar173._8_4_ * auVar85._8_4_;
                        auVar174._12_4_ = auVar173._12_4_ * auVar85._12_4_;
                        auVar86 = vfmsub231ps_fma(auVar174,auVar86,auVar84);
                        auVar84 = vshufps_avx(auVar86,auVar86,0xc9);
                        auVar85 = vshufps_avx(auVar87,auVar87,0xc9);
                        auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                        auVar150._0_4_ = auVar87._0_4_ * auVar86._0_4_;
                        auVar150._4_4_ = auVar87._4_4_ * auVar86._4_4_;
                        auVar150._8_4_ = auVar87._8_4_ * auVar86._8_4_;
                        auVar150._12_4_ = auVar87._12_4_ * auVar86._12_4_;
                        auVar84 = vfmsub231ps_fma(auVar150,auVar84,auVar85);
                        uVar210 = auVar84._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar231;
                          uVar3 = vextractps_avx(auVar84,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                          uVar3 = vextractps_avx(auVar84,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = uVar210;
                          *(float *)(ray + k * 4 + 0xf0) = fVar230;
                          *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                          *(undefined4 *)(ray + k * 4 + 0x110) = uVar1;
                          *(uint *)(ray + k * 4 + 0x120) = uVar78;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_5e0 = (RTCHitN  [16])vshufps_avx(auVar84,auVar84,0x55);
                          auStack_5d0 = vshufps_avx(auVar84,auVar84,0xaa);
                          local_5c0 = uVar210;
                          uStack_5bc = uVar210;
                          uStack_5b8 = uVar210;
                          uStack_5b4 = uVar210;
                          local_5b0 = fVar230;
                          fStack_5ac = fVar230;
                          fStack_5a8 = fVar230;
                          fStack_5a4 = fVar230;
                          local_5a0 = ZEXT416(0) << 0x20;
                          local_590 = local_600._0_8_;
                          uStack_588 = local_600._8_8_;
                          local_580 = local_5f0;
                          vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                          uStack_56c = context->user->instID[0];
                          local_570 = uStack_56c;
                          uStack_568 = uStack_56c;
                          uStack_564 = uStack_56c;
                          uStack_560 = context->user->instPrimID[0];
                          uStack_55c = uStack_560;
                          uStack_558 = uStack_560;
                          uStack_554 = uStack_560;
                          *(float *)(ray + k * 4 + 0x80) = fVar231;
                          local_8f0 = local_610._0_8_;
                          uStack_8e8 = local_610._8_8_;
                          local_870.valid = (int *)&local_8f0;
                          local_870.geometryUserPtr = pGVar4->userPtr;
                          local_870.context = context->user;
                          local_870.hit = local_5e0;
                          local_870.N = 4;
                          local_870.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar4->intersectionFilterN)(&local_870);
                            auVar246 = ZEXT3264(local_800);
                            auVar248 = ZEXT3264(local_8c0);
                            auVar247 = ZEXT3264(local_8a0);
                            auVar241._8_4_ = 0x7fffffff;
                            auVar241._0_8_ = 0x7fffffff7fffffff;
                            auVar241._12_4_ = 0x7fffffff;
                          }
                          auVar60._8_8_ = uStack_8e8;
                          auVar60._0_8_ = local_8f0;
                          uVar81 = vptestmd_avx512vl(auVar60,auVar60);
                          if ((uVar81 & 0xf) == 0) {
LAB_01d0842e:
                            *(float *)(ray + k * 4 + 0x80) = fVar240;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var5)(&local_870);
                              auVar246 = ZEXT3264(local_800);
                              auVar248 = ZEXT3264(local_8c0);
                              auVar247 = ZEXT3264(local_8a0);
                              auVar241._8_4_ = 0x7fffffff;
                              auVar241._0_8_ = 0x7fffffff7fffffff;
                              auVar241._12_4_ = 0x7fffffff;
                            }
                            auVar61._8_8_ = uStack_8e8;
                            auVar61._0_8_ = local_8f0;
                            uVar81 = vptestmd_avx512vl(auVar61,auVar61);
                            uVar81 = uVar81 & 0xf;
                            bVar76 = (byte)uVar81;
                            if (bVar76 == 0) goto LAB_01d0842e;
                            iVar57 = *(int *)(local_870.hit + 4);
                            iVar58 = *(int *)(local_870.hit + 8);
                            iVar59 = *(int *)(local_870.hit + 0xc);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = SUB81(uVar81 >> 3,0);
                            *(uint *)(local_870.ray + 0xc0) =
                                 (uint)(bVar76 & 1) * *(int *)local_870.hit |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0xc0);
                            *(uint *)(local_870.ray + 0xc4) =
                                 (uint)bVar80 * iVar57 |
                                 (uint)!bVar80 * *(int *)(local_870.ray + 0xc4);
                            *(uint *)(local_870.ray + 200) =
                                 (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_870.ray + 200)
                            ;
                            *(uint *)(local_870.ray + 0xcc) =
                                 (uint)bVar8 * iVar59 |
                                 (uint)!bVar8 * *(int *)(local_870.ray + 0xcc);
                            iVar57 = *(int *)(local_870.hit + 0x14);
                            iVar58 = *(int *)(local_870.hit + 0x18);
                            iVar59 = *(int *)(local_870.hit + 0x1c);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = SUB81(uVar81 >> 3,0);
                            *(uint *)(local_870.ray + 0xd0) =
                                 (uint)(bVar76 & 1) * *(int *)(local_870.hit + 0x10) |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0xd0);
                            *(uint *)(local_870.ray + 0xd4) =
                                 (uint)bVar80 * iVar57 |
                                 (uint)!bVar80 * *(int *)(local_870.ray + 0xd4);
                            *(uint *)(local_870.ray + 0xd8) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_870.ray + 0xd8);
                            *(uint *)(local_870.ray + 0xdc) =
                                 (uint)bVar8 * iVar59 |
                                 (uint)!bVar8 * *(int *)(local_870.ray + 0xdc);
                            iVar57 = *(int *)(local_870.hit + 0x24);
                            iVar58 = *(int *)(local_870.hit + 0x28);
                            iVar59 = *(int *)(local_870.hit + 0x2c);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = SUB81(uVar81 >> 3,0);
                            *(uint *)(local_870.ray + 0xe0) =
                                 (uint)(bVar76 & 1) * *(int *)(local_870.hit + 0x20) |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0xe0);
                            *(uint *)(local_870.ray + 0xe4) =
                                 (uint)bVar80 * iVar57 |
                                 (uint)!bVar80 * *(int *)(local_870.ray + 0xe4);
                            *(uint *)(local_870.ray + 0xe8) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_870.ray + 0xe8);
                            *(uint *)(local_870.ray + 0xec) =
                                 (uint)bVar8 * iVar59 |
                                 (uint)!bVar8 * *(int *)(local_870.ray + 0xec);
                            iVar57 = *(int *)(local_870.hit + 0x34);
                            iVar58 = *(int *)(local_870.hit + 0x38);
                            iVar59 = *(int *)(local_870.hit + 0x3c);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = SUB81(uVar81 >> 3,0);
                            *(uint *)(local_870.ray + 0xf0) =
                                 (uint)(bVar76 & 1) * *(int *)(local_870.hit + 0x30) |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0xf0);
                            *(uint *)(local_870.ray + 0xf4) =
                                 (uint)bVar80 * iVar57 |
                                 (uint)!bVar80 * *(int *)(local_870.ray + 0xf4);
                            *(uint *)(local_870.ray + 0xf8) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_870.ray + 0xf8);
                            *(uint *)(local_870.ray + 0xfc) =
                                 (uint)bVar8 * iVar59 |
                                 (uint)!bVar8 * *(int *)(local_870.ray + 0xfc);
                            iVar57 = *(int *)(local_870.hit + 0x44);
                            iVar58 = *(int *)(local_870.hit + 0x48);
                            iVar59 = *(int *)(local_870.hit + 0x4c);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = SUB81(uVar81 >> 3,0);
                            *(uint *)(local_870.ray + 0x100) =
                                 (uint)(bVar76 & 1) * *(int *)(local_870.hit + 0x40) |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_870.ray + 0x100);
                            *(uint *)(local_870.ray + 0x104) =
                                 (uint)bVar80 * iVar57 |
                                 (uint)!bVar80 * *(int *)(local_870.ray + 0x104);
                            *(uint *)(local_870.ray + 0x108) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_870.ray + 0x108);
                            *(uint *)(local_870.ray + 0x10c) =
                                 (uint)bVar8 * iVar59 |
                                 (uint)!bVar8 * *(int *)(local_870.ray + 0x10c);
                            auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_870.hit + 0x50));
                            *(undefined1 (*) [16])(local_870.ray + 0x110) = auVar84;
                            auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_870.hit + 0x60));
                            *(undefined1 (*) [16])(local_870.ray + 0x120) = auVar84;
                            auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_870.hit + 0x70));
                            *(undefined1 (*) [16])(local_870.ray + 0x130) = auVar84;
                            auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_870.hit + 0x80));
                            *(undefined1 (*) [16])(local_870.ray + 0x140) = auVar84;
                          }
                          auVar221 = ZEXT464((uint)fVar240);
                        }
                      }
                    }
                  }
                }
                bVar80 = lVar79 != 0;
                lVar79 = lVar79 + -1;
              } while ((!bVar6) && (bVar80));
              auVar64._4_4_ = fStack_51c;
              auVar64._0_4_ = local_520;
              auVar64._8_4_ = fStack_518;
              auVar64._12_4_ = fStack_514;
              auVar64._16_4_ = fStack_510;
              auVar64._20_4_ = fStack_50c;
              auVar64._24_4_ = fStack_508;
              auVar64._28_4_ = fStack_504;
              uVar210 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar32._4_4_ = uVar210;
              auVar32._0_4_ = uVar210;
              auVar32._8_4_ = uVar210;
              auVar32._12_4_ = uVar210;
              auVar32._16_4_ = uVar210;
              auVar32._20_4_ = uVar210;
              auVar32._24_4_ = uVar210;
              auVar32._28_4_ = uVar210;
              uVar14 = vcmpps_avx512vl(auVar64,auVar32,2);
              bVar72 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar72 & (byte)uVar14;
            } while (bVar72 != 0);
          }
          auVar163._0_4_ = (float)local_540._0_4_ + (float)local_660._0_4_;
          auVar163._4_4_ = (float)local_540._4_4_ + (float)local_660._4_4_;
          auVar163._8_4_ = fStack_538 + fStack_658;
          auVar163._12_4_ = fStack_534 + fStack_654;
          auVar163._16_4_ = fStack_530 + fStack_650;
          auVar163._20_4_ = fStack_52c + fStack_64c;
          auVar163._24_4_ = fStack_528 + fStack_648;
          auVar163._28_4_ = fStack_524 + fStack_644;
          uVar210 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar33._4_4_ = uVar210;
          auVar33._0_4_ = uVar210;
          auVar33._8_4_ = uVar210;
          auVar33._12_4_ = uVar210;
          auVar33._16_4_ = uVar210;
          auVar33._20_4_ = uVar210;
          auVar33._24_4_ = uVar210;
          auVar33._28_4_ = uVar210;
          uVar14 = vcmpps_avx512vl(auVar163,auVar33,2);
          bVar76 = (byte)local_8cc | (byte)local_8d4;
          bVar70 = (byte)uVar15 & bVar70 & (byte)uVar14;
          auVar164._8_4_ = 2;
          auVar164._0_8_ = 0x200000002;
          auVar164._12_4_ = 2;
          auVar164._16_4_ = 2;
          auVar164._20_4_ = 2;
          auVar164._24_4_ = 2;
          auVar164._28_4_ = 2;
          auVar34._8_4_ = 3;
          auVar34._0_8_ = 0x300000003;
          auVar34._12_4_ = 3;
          auVar34._16_4_ = 3;
          auVar34._20_4_ = 3;
          auVar34._24_4_ = 3;
          auVar34._28_4_ = 3;
          auVar98 = vpblendmd_avx512vl(auVar164,auVar34);
          local_540._0_4_ = (uint)(bVar76 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar76 & 1) * 2;
          bVar6 = (bool)(bVar76 >> 1 & 1);
          local_540._4_4_ = (uint)bVar6 * auVar98._4_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar76 >> 2 & 1);
          fStack_538 = (float)((uint)bVar6 * auVar98._8_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar76 >> 3 & 1);
          fStack_534 = (float)((uint)bVar6 * auVar98._12_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar76 >> 4 & 1);
          fStack_530 = (float)((uint)bVar6 * auVar98._16_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar76 >> 5 & 1);
          fStack_52c = (float)((uint)bVar6 * auVar98._20_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar76 >> 6 & 1);
          fStack_528 = (float)((uint)bVar6 * auVar98._24_4_ | (uint)!bVar6 * 2);
          fStack_524 = (float)((uint)(bVar76 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar76 >> 7) * 2
                              );
          uVar14 = vpcmpd_avx512vl(_local_540,local_4c0,2);
          bVar76 = (byte)uVar14 & bVar70;
          if (bVar76 != 0) {
            auVar85 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar84 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar86 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
            auVar87 = vminps_avx(auVar85,auVar86);
            auVar85 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
            auVar86 = vmaxps_avx(auVar84,auVar85);
            auVar84 = vandps_avx(auVar241,auVar87);
            auVar85 = vandps_avx(auVar241,auVar86);
            auVar84 = vmaxps_avx(auVar84,auVar85);
            auVar85 = vmovshdup_avx(auVar84);
            auVar85 = vmaxss_avx(auVar85,auVar84);
            auVar84 = vshufpd_avx(auVar84,auVar84,1);
            auVar84 = vmaxss_avx(auVar84,auVar85);
            fVar146 = auVar84._0_4_ * 1.9073486e-06;
            local_770 = vshufps_avx(auVar86,auVar86,0xff);
            _local_680 = _local_480;
            local_520 = (float)local_480._0_4_ + (float)local_660._0_4_;
            fStack_51c = (float)local_480._4_4_ + (float)local_660._4_4_;
            fStack_518 = fStack_478 + fStack_658;
            fStack_514 = fStack_474 + fStack_654;
            fStack_510 = fStack_470 + fStack_650;
            fStack_50c = fStack_46c + fStack_64c;
            fStack_508 = fStack_468 + fStack_648;
            fStack_504 = fStack_464 + fStack_644;
            do {
              auVar165._8_4_ = 0x7f800000;
              auVar165._0_8_ = 0x7f8000007f800000;
              auVar165._12_4_ = 0x7f800000;
              auVar165._16_4_ = 0x7f800000;
              auVar165._20_4_ = 0x7f800000;
              auVar165._24_4_ = 0x7f800000;
              auVar165._28_4_ = 0x7f800000;
              auVar98 = vblendmps_avx512vl(auVar165,_local_680);
              auVar135._0_4_ =
                   (uint)(bVar76 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar76 & 1) * 0x7f800000;
              bVar6 = (bool)(bVar76 >> 1 & 1);
              auVar135._4_4_ = (uint)bVar6 * auVar98._4_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar76 >> 2 & 1);
              auVar135._8_4_ = (uint)bVar6 * auVar98._8_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar76 >> 3 & 1);
              auVar135._12_4_ = (uint)bVar6 * auVar98._12_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar76 >> 4 & 1);
              auVar135._16_4_ = (uint)bVar6 * auVar98._16_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar76 >> 5 & 1);
              auVar135._20_4_ = (uint)bVar6 * auVar98._20_4_ | (uint)!bVar6 * 0x7f800000;
              auVar135._24_4_ =
                   (uint)(bVar76 >> 6) * auVar98._24_4_ | (uint)!(bool)(bVar76 >> 6) * 0x7f800000;
              auVar135._28_4_ = 0x7f800000;
              auVar98 = vshufps_avx(auVar135,auVar135,0xb1);
              auVar98 = vminps_avx(auVar135,auVar98);
              auVar96 = vshufpd_avx(auVar98,auVar98,5);
              auVar98 = vminps_avx(auVar98,auVar96);
              auVar96 = vpermpd_avx2(auVar98,0x4e);
              auVar98 = vminps_avx(auVar98,auVar96);
              uVar14 = vcmpps_avx512vl(auVar135,auVar98,0);
              bVar71 = (byte)uVar14 & bVar76;
              bVar72 = bVar76;
              if (bVar71 != 0) {
                bVar72 = bVar71;
              }
              iVar17 = 0;
              for (uVar75 = (uint)bVar72; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              fVar230 = *(float *)(local_500 + (uint)(iVar17 << 2));
              fVar231 = *(float *)(local_460 + (uint)(iVar17 << 2));
              fVar233 = local_8c4;
              if ((float)local_790._0_4_ < 0.0) {
                fVar233 = sqrtf((float)local_790._0_4_);
              }
              lVar79 = 4;
              do {
                auVar151._4_4_ = fVar231;
                auVar151._0_4_ = fVar231;
                auVar151._8_4_ = fVar231;
                auVar151._12_4_ = fVar231;
                auVar85 = vfmadd132ps_fma(auVar151,ZEXT816(0) << 0x40,local_780);
                fVar240 = 1.0 - fVar230;
                auVar196._0_4_ = local_6e0._0_4_ * fVar230;
                auVar196._4_4_ = local_6e0._4_4_ * fVar230;
                auVar196._8_4_ = local_6e0._8_4_ * fVar230;
                auVar196._12_4_ = local_6e0._12_4_ * fVar230;
                local_710 = ZEXT416((uint)fVar240);
                auVar212._4_4_ = fVar240;
                auVar212._0_4_ = fVar240;
                auVar212._8_4_ = fVar240;
                auVar212._12_4_ = fVar240;
                auVar84 = vfmadd231ps_fma(auVar196,auVar212,local_6a0._0_16_);
                auVar218._0_4_ = local_6c0._0_4_ * fVar230;
                auVar218._4_4_ = local_6c0._4_4_ * fVar230;
                auVar218._8_4_ = local_6c0._8_4_ * fVar230;
                auVar218._12_4_ = local_6c0._12_4_ * fVar230;
                auVar86 = vfmadd231ps_fma(auVar218,auVar212,local_6e0._0_16_);
                auVar223._0_4_ = fVar230 * (float)local_700._0_4_;
                auVar223._4_4_ = fVar230 * (float)local_700._4_4_;
                auVar223._8_4_ = fVar230 * fStack_6f8;
                auVar223._12_4_ = fVar230 * fStack_6f4;
                auVar87 = vfmadd231ps_fma(auVar223,auVar212,local_6c0._0_16_);
                auVar228._0_4_ = fVar230 * auVar86._0_4_;
                auVar228._4_4_ = fVar230 * auVar86._4_4_;
                auVar228._8_4_ = fVar230 * auVar86._8_4_;
                auVar228._12_4_ = fVar230 * auVar86._12_4_;
                auVar84 = vfmadd231ps_fma(auVar228,auVar212,auVar84);
                auVar197._0_4_ = fVar230 * auVar87._0_4_;
                auVar197._4_4_ = fVar230 * auVar87._4_4_;
                auVar197._8_4_ = fVar230 * auVar87._8_4_;
                auVar197._12_4_ = fVar230 * auVar87._12_4_;
                auVar86 = vfmadd231ps_fma(auVar197,auVar212,auVar86);
                auVar219._0_4_ = fVar230 * auVar86._0_4_;
                auVar219._4_4_ = fVar230 * auVar86._4_4_;
                auVar219._8_4_ = fVar230 * auVar86._8_4_;
                auVar219._12_4_ = fVar230 * auVar86._12_4_;
                auVar87 = vfmadd231ps_fma(auVar219,auVar84,auVar212);
                auVar84 = vsubps_avx(auVar86,auVar84);
                auVar21._8_4_ = 0x40400000;
                auVar21._0_8_ = 0x4040000040400000;
                auVar21._12_4_ = 0x40400000;
                auVar86 = vmulps_avx512vl(auVar84,auVar21);
                local_640._0_16_ = auVar87;
                auVar84 = vsubps_avx(auVar85,auVar87);
                local_7c0._0_16_ = auVar84;
                auVar84 = vdpps_avx(auVar84,auVar84,0x7f);
                local_7e0._0_16_ = auVar84;
                local_940 = ZEXT416((uint)fVar230);
                if (auVar84._0_4_ < 0.0) {
                  auVar247._0_4_ = sqrtf(auVar84._0_4_);
                  auVar247._4_60_ = extraout_var_01;
                  auVar84 = auVar247._0_16_;
                }
                else {
                  auVar84 = vsqrtss_avx(auVar84,auVar84);
                }
                local_720 = vdpps_avx(auVar86,auVar86,0x7f);
                fVar240 = local_720._0_4_;
                auVar198._4_12_ = ZEXT812(0) << 0x20;
                auVar198._0_4_ = fVar240;
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar198);
                fVar167 = auVar85._0_4_;
                local_730 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar198);
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar87 = vxorps_avx512vl(local_720,auVar22);
                auVar85 = vfnmadd213ss_fma(local_730,local_720,ZEXT416(0x40000000));
                uVar75 = auVar84._0_4_;
                if (fVar240 < auVar87._0_4_) {
                  auVar248._0_4_ = sqrtf(fVar240);
                  auVar248._4_60_ = extraout_var_02;
                  auVar84 = ZEXT416(uVar75);
                  auVar87 = auVar248._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx512f(local_720,local_720);
                }
                fVar240 = fVar167 * 1.5 + fVar240 * -0.5 * fVar167 * fVar167 * fVar167;
                auVar152._0_4_ = auVar86._0_4_ * fVar240;
                auVar152._4_4_ = auVar86._4_4_ * fVar240;
                auVar152._8_4_ = auVar86._8_4_ * fVar240;
                auVar152._12_4_ = auVar86._12_4_ * fVar240;
                auVar82 = vdpps_avx(local_7c0._0_16_,auVar152,0x7f);
                fVar208 = auVar84._0_4_;
                fVar167 = auVar82._0_4_;
                auVar153._0_4_ = fVar167 * fVar167;
                auVar153._4_4_ = auVar82._4_4_ * auVar82._4_4_;
                auVar153._8_4_ = auVar82._8_4_ * auVar82._8_4_;
                auVar153._12_4_ = auVar82._12_4_ * auVar82._12_4_;
                auVar88 = vsubps_avx512vl(local_7e0._0_16_,auVar153);
                fVar235 = auVar88._0_4_;
                auVar175._4_12_ = ZEXT812(0) << 0x20;
                auVar175._0_4_ = fVar235;
                auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar175);
                auVar83 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
                auVar90 = vmulss_avx512f(auVar88,ZEXT416(0xbf000000));
                if (fVar235 < 0.0) {
                  local_750 = fVar240;
                  fStack_74c = fVar240;
                  fStack_748 = fVar240;
                  fStack_744 = fVar240;
                  local_740 = auVar89;
                  fVar235 = sqrtf(fVar235);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar83 = ZEXT416(auVar83._0_4_);
                  auVar87 = ZEXT416(auVar87._0_4_);
                  auVar84 = ZEXT416(uVar75);
                  auVar89 = local_740;
                  fVar240 = local_750;
                  fVar236 = fStack_74c;
                  fVar232 = fStack_748;
                  fVar234 = fStack_744;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  fVar235 = auVar88._0_4_;
                  fVar236 = fVar240;
                  fVar232 = fVar240;
                  fVar234 = fVar240;
                }
                auVar239._8_4_ = 0x7fffffff;
                auVar239._0_8_ = 0x7fffffff7fffffff;
                auVar239._12_4_ = 0x7fffffff;
                auVar247 = ZEXT3264(local_8a0);
                auVar248 = ZEXT3264(local_8c0);
                auVar246 = ZEXT3264(local_800);
                auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_940,local_710);
                fVar168 = auVar88._0_4_ * 6.0;
                fVar13 = fVar230 * 6.0;
                auVar199._0_4_ = fVar13 * (float)local_700._0_4_;
                auVar199._4_4_ = fVar13 * (float)local_700._4_4_;
                auVar199._8_4_ = fVar13 * fStack_6f8;
                auVar199._12_4_ = fVar13 * fStack_6f4;
                auVar176._4_4_ = fVar168;
                auVar176._0_4_ = fVar168;
                auVar176._8_4_ = fVar168;
                auVar176._12_4_ = fVar168;
                auVar88 = vfmadd132ps_fma(auVar176,auVar199,local_6c0._0_16_);
                auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_710,local_940);
                fVar168 = auVar92._0_4_ * 6.0;
                auVar200._4_4_ = fVar168;
                auVar200._0_4_ = fVar168;
                auVar200._8_4_ = fVar168;
                auVar200._12_4_ = fVar168;
                auVar88 = vfmadd132ps_fma(auVar200,auVar88,local_6e0._0_16_);
                fVar168 = local_710._0_4_ * 6.0;
                auVar177._4_4_ = fVar168;
                auVar177._0_4_ = fVar168;
                auVar177._8_4_ = fVar168;
                auVar177._12_4_ = fVar168;
                auVar88 = vfmadd132ps_fma(auVar177,auVar88,local_6a0._0_16_);
                auVar201._0_4_ = auVar88._0_4_ * (float)local_720._0_4_;
                auVar201._4_4_ = auVar88._4_4_ * (float)local_720._0_4_;
                auVar201._8_4_ = auVar88._8_4_ * (float)local_720._0_4_;
                auVar201._12_4_ = auVar88._12_4_ * (float)local_720._0_4_;
                auVar88 = vdpps_avx(auVar86,auVar88,0x7f);
                fVar168 = auVar88._0_4_;
                auVar178._0_4_ = auVar86._0_4_ * fVar168;
                auVar178._4_4_ = auVar86._4_4_ * fVar168;
                auVar178._8_4_ = auVar86._8_4_ * fVar168;
                auVar178._12_4_ = auVar86._12_4_ * fVar168;
                auVar88 = vsubps_avx(auVar201,auVar178);
                fVar168 = auVar85._0_4_ * (float)local_730._0_4_;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar137._16_16_ = local_800._16_16_;
                auVar91 = vxorps_avx512vl(auVar86,auVar23);
                auVar220._0_4_ = fVar240 * auVar88._0_4_ * fVar168;
                auVar220._4_4_ = fVar236 * auVar88._4_4_ * fVar168;
                auVar220._8_4_ = fVar232 * auVar88._8_4_ * fVar168;
                auVar220._12_4_ = fVar234 * auVar88._12_4_ * fVar168;
                auVar85 = vdpps_avx(auVar91,auVar152,0x7f);
                auVar88 = vmaxss_avx(ZEXT416((uint)fVar146),
                                     ZEXT416((uint)(fVar231 * fVar233 * 1.9073486e-06)));
                auVar92 = vdivss_avx512f(ZEXT416((uint)fVar146),auVar87);
                auVar87 = vdpps_avx(local_7c0._0_16_,auVar220,0x7f);
                auVar84 = vfmadd213ss_fma(auVar84,ZEXT416((uint)fVar146),auVar88);
                auVar92 = vfmadd213ss_fma(ZEXT416((uint)(fVar208 + 1.0)),auVar92,auVar84);
                auVar84 = vdpps_avx(local_780,auVar152,0x7f);
                fVar240 = auVar85._0_4_ + auVar87._0_4_;
                auVar85 = vdpps_avx(local_7c0._0_16_,auVar91,0x7f);
                auVar90 = vmulss_avx512f(auVar90,auVar89);
                auVar89 = vmulss_avx512f(auVar89,auVar89);
                auVar87 = vdpps_avx(local_7c0._0_16_,local_780,0x7f);
                auVar90 = vaddss_avx512f(auVar83,ZEXT416((uint)(auVar90._0_4_ * auVar89._0_4_)));
                auVar89 = vfnmadd231ss_fma(auVar85,auVar82,ZEXT416((uint)fVar240));
                auVar83 = vfnmadd231ss_fma(auVar87,auVar82,auVar84);
                auVar85 = vpermilps_avx(local_640._0_16_,0xff);
                fVar235 = fVar235 - auVar85._0_4_;
                auVar85 = vshufps_avx(auVar86,auVar86,0xff);
                auVar87 = vfmsub213ss_fma(auVar89,auVar90,auVar85);
                fVar208 = auVar83._0_4_ * auVar90._0_4_;
                auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar87._0_4_)),
                                          ZEXT416((uint)fVar240),ZEXT416((uint)fVar208));
                fVar236 = auVar89._0_4_;
                fVar240 = fVar235 * (fVar240 / fVar236) - fVar167 * (auVar87._0_4_ / fVar236);
                auVar221 = ZEXT464((uint)fVar240);
                fVar230 = fVar230 - (fVar167 * (fVar208 / fVar236) -
                                    fVar235 * (auVar84._0_4_ / fVar236));
                fVar231 = fVar231 - fVar240;
                auVar84 = vandps_avx(auVar82,auVar239);
                if (auVar92._0_4_ <= auVar84._0_4_) {
LAB_01d08c89:
                  bVar6 = false;
                }
                else {
                  auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar92._0_4_ + auVar88._0_4_)),local_770
                                            ,ZEXT416(0x36000000));
                  auVar84 = vandps_avx(auVar239,ZEXT416((uint)fVar235));
                  if (auVar87._0_4_ <= auVar84._0_4_) goto LAB_01d08c89;
                  fVar231 = fVar231 + (float)local_760._0_4_;
                  bVar6 = true;
                  if (fVar209 <= fVar231) {
                    fVar240 = *(float *)(ray + k * 4 + 0x80);
                    auVar221 = ZEXT464((uint)fVar240);
                    if (((fVar231 <= fVar240) && (0.0 <= fVar230)) && (fVar230 <= 1.0)) {
                      auVar137._0_16_ = ZEXT816(0) << 0x20;
                      auVar136._4_28_ = auVar137._4_28_;
                      auVar136._0_4_ = local_7e0._0_4_;
                      auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar136._0_16_);
                      fVar167 = auVar84._0_4_;
                      auVar84 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                      pGVar4 = (context->scene->geometries).items[uVar78].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        fVar167 = fVar167 * 1.5 + auVar84._0_4_ * fVar167 * fVar167 * fVar167;
                        auVar179._0_4_ = local_7c0._0_4_ * fVar167;
                        auVar179._4_4_ = local_7c0._4_4_ * fVar167;
                        auVar179._8_4_ = local_7c0._8_4_ * fVar167;
                        auVar179._12_4_ = local_7c0._12_4_ * fVar167;
                        auVar87 = vfmadd213ps_fma(auVar85,auVar179,auVar86);
                        auVar84 = vshufps_avx(auVar179,auVar179,0xc9);
                        auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                        auVar180._0_4_ = auVar179._0_4_ * auVar85._0_4_;
                        auVar180._4_4_ = auVar179._4_4_ * auVar85._4_4_;
                        auVar180._8_4_ = auVar179._8_4_ * auVar85._8_4_;
                        auVar180._12_4_ = auVar179._12_4_ * auVar85._12_4_;
                        auVar86 = vfmsub231ps_fma(auVar180,auVar86,auVar84);
                        auVar84 = vshufps_avx(auVar86,auVar86,0xc9);
                        auVar85 = vshufps_avx(auVar87,auVar87,0xc9);
                        auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                        auVar154._0_4_ = auVar87._0_4_ * auVar86._0_4_;
                        auVar154._4_4_ = auVar87._4_4_ * auVar86._4_4_;
                        auVar154._8_4_ = auVar87._8_4_ * auVar86._8_4_;
                        auVar154._12_4_ = auVar87._12_4_ * auVar86._12_4_;
                        auVar84 = vfmsub231ps_fma(auVar154,auVar84,auVar85);
                        uVar210 = auVar84._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar231;
                          uVar3 = vextractps_avx(auVar84,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                          uVar3 = vextractps_avx(auVar84,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = uVar210;
                          *(float *)(ray + k * 4 + 0xf0) = fVar230;
                          *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                          *(undefined4 *)(ray + k * 4 + 0x110) = uVar1;
                          *(uint *)(ray + k * 4 + 0x120) = uVar78;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_5e0 = (RTCHitN  [16])vshufps_avx(auVar84,auVar84,0x55);
                          auStack_5d0 = vshufps_avx(auVar84,auVar84,0xaa);
                          local_5c0 = uVar210;
                          uStack_5bc = uVar210;
                          uStack_5b8 = uVar210;
                          uStack_5b4 = uVar210;
                          local_5b0 = fVar230;
                          fStack_5ac = fVar230;
                          fStack_5a8 = fVar230;
                          fStack_5a4 = fVar230;
                          local_5a0 = ZEXT416(0) << 0x20;
                          local_590 = local_600._0_8_;
                          uStack_588 = local_600._8_8_;
                          local_580 = local_5f0;
                          vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                          uStack_56c = context->user->instID[0];
                          local_570 = uStack_56c;
                          uStack_568 = uStack_56c;
                          uStack_564 = uStack_56c;
                          uStack_560 = context->user->instPrimID[0];
                          uStack_55c = uStack_560;
                          uStack_558 = uStack_560;
                          uStack_554 = uStack_560;
                          *(float *)(ray + k * 4 + 0x80) = fVar231;
                          local_8f0 = local_610._0_8_;
                          uStack_8e8 = local_610._8_8_;
                          local_870.valid = (int *)&local_8f0;
                          local_870.geometryUserPtr = pGVar4->userPtr;
                          local_870.context = context->user;
                          local_870.hit = local_5e0;
                          local_870.N = 4;
                          local_870.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar4->intersectionFilterN)(&local_870);
                            auVar246 = ZEXT3264(local_800);
                            auVar248 = ZEXT3264(local_8c0);
                            auVar247 = ZEXT3264(local_8a0);
                          }
                          auVar62._8_8_ = uStack_8e8;
                          auVar62._0_8_ = local_8f0;
                          uVar81 = vptestmd_avx512vl(auVar62,auVar62);
                          if ((uVar81 & 0xf) == 0) {
LAB_01d08f23:
                            *(float *)(ray + k * 4 + 0x80) = fVar240;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var5)(&local_870);
                              auVar246 = ZEXT3264(local_800);
                              auVar248 = ZEXT3264(local_8c0);
                              auVar247 = ZEXT3264(local_8a0);
                            }
                            auVar63._8_8_ = uStack_8e8;
                            auVar63._0_8_ = local_8f0;
                            uVar81 = vptestmd_avx512vl(auVar63,auVar63);
                            uVar81 = uVar81 & 0xf;
                            bVar72 = (byte)uVar81;
                            if (bVar72 == 0) goto LAB_01d08f23;
                            iVar57 = *(int *)(local_870.hit + 4);
                            iVar58 = *(int *)(local_870.hit + 8);
                            iVar59 = *(int *)(local_870.hit + 0xc);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = SUB81(uVar81 >> 3,0);
                            *(uint *)(local_870.ray + 0xc0) =
                                 (uint)(bVar72 & 1) * *(int *)local_870.hit |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_870.ray + 0xc0);
                            *(uint *)(local_870.ray + 0xc4) =
                                 (uint)bVar80 * iVar57 |
                                 (uint)!bVar80 * *(int *)(local_870.ray + 0xc4);
                            *(uint *)(local_870.ray + 200) =
                                 (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_870.ray + 200)
                            ;
                            *(uint *)(local_870.ray + 0xcc) =
                                 (uint)bVar8 * iVar59 |
                                 (uint)!bVar8 * *(int *)(local_870.ray + 0xcc);
                            iVar57 = *(int *)(local_870.hit + 0x14);
                            iVar58 = *(int *)(local_870.hit + 0x18);
                            iVar59 = *(int *)(local_870.hit + 0x1c);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = SUB81(uVar81 >> 3,0);
                            *(uint *)(local_870.ray + 0xd0) =
                                 (uint)(bVar72 & 1) * *(int *)(local_870.hit + 0x10) |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_870.ray + 0xd0);
                            *(uint *)(local_870.ray + 0xd4) =
                                 (uint)bVar80 * iVar57 |
                                 (uint)!bVar80 * *(int *)(local_870.ray + 0xd4);
                            *(uint *)(local_870.ray + 0xd8) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_870.ray + 0xd8);
                            *(uint *)(local_870.ray + 0xdc) =
                                 (uint)bVar8 * iVar59 |
                                 (uint)!bVar8 * *(int *)(local_870.ray + 0xdc);
                            iVar57 = *(int *)(local_870.hit + 0x24);
                            iVar58 = *(int *)(local_870.hit + 0x28);
                            iVar59 = *(int *)(local_870.hit + 0x2c);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = SUB81(uVar81 >> 3,0);
                            *(uint *)(local_870.ray + 0xe0) =
                                 (uint)(bVar72 & 1) * *(int *)(local_870.hit + 0x20) |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_870.ray + 0xe0);
                            *(uint *)(local_870.ray + 0xe4) =
                                 (uint)bVar80 * iVar57 |
                                 (uint)!bVar80 * *(int *)(local_870.ray + 0xe4);
                            *(uint *)(local_870.ray + 0xe8) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_870.ray + 0xe8);
                            *(uint *)(local_870.ray + 0xec) =
                                 (uint)bVar8 * iVar59 |
                                 (uint)!bVar8 * *(int *)(local_870.ray + 0xec);
                            iVar57 = *(int *)(local_870.hit + 0x34);
                            iVar58 = *(int *)(local_870.hit + 0x38);
                            iVar59 = *(int *)(local_870.hit + 0x3c);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = SUB81(uVar81 >> 3,0);
                            *(uint *)(local_870.ray + 0xf0) =
                                 (uint)(bVar72 & 1) * *(int *)(local_870.hit + 0x30) |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_870.ray + 0xf0);
                            *(uint *)(local_870.ray + 0xf4) =
                                 (uint)bVar80 * iVar57 |
                                 (uint)!bVar80 * *(int *)(local_870.ray + 0xf4);
                            *(uint *)(local_870.ray + 0xf8) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_870.ray + 0xf8);
                            *(uint *)(local_870.ray + 0xfc) =
                                 (uint)bVar8 * iVar59 |
                                 (uint)!bVar8 * *(int *)(local_870.ray + 0xfc);
                            iVar57 = *(int *)(local_870.hit + 0x44);
                            iVar58 = *(int *)(local_870.hit + 0x48);
                            iVar59 = *(int *)(local_870.hit + 0x4c);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = SUB81(uVar81 >> 3,0);
                            *(uint *)(local_870.ray + 0x100) =
                                 (uint)(bVar72 & 1) * *(int *)(local_870.hit + 0x40) |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_870.ray + 0x100);
                            *(uint *)(local_870.ray + 0x104) =
                                 (uint)bVar80 * iVar57 |
                                 (uint)!bVar80 * *(int *)(local_870.ray + 0x104);
                            *(uint *)(local_870.ray + 0x108) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_870.ray + 0x108);
                            *(uint *)(local_870.ray + 0x10c) =
                                 (uint)bVar8 * iVar59 |
                                 (uint)!bVar8 * *(int *)(local_870.ray + 0x10c);
                            auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_870.hit + 0x50));
                            *(undefined1 (*) [16])(local_870.ray + 0x110) = auVar84;
                            auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_870.hit + 0x60));
                            *(undefined1 (*) [16])(local_870.ray + 0x120) = auVar84;
                            auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_870.hit + 0x70));
                            *(undefined1 (*) [16])(local_870.ray + 0x130) = auVar84;
                            auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_870.hit + 0x80));
                            *(undefined1 (*) [16])(local_870.ray + 0x140) = auVar84;
                          }
                          auVar221 = ZEXT464((uint)fVar240);
                        }
                      }
                    }
                  }
                }
                bVar80 = lVar79 != 0;
                lVar79 = lVar79 + -1;
              } while ((!bVar6) && (bVar80));
              auVar65._4_4_ = fStack_51c;
              auVar65._0_4_ = local_520;
              auVar65._8_4_ = fStack_518;
              auVar65._12_4_ = fStack_514;
              auVar65._16_4_ = fStack_510;
              auVar65._20_4_ = fStack_50c;
              auVar65._24_4_ = fStack_508;
              auVar65._28_4_ = fStack_504;
              uVar210 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar35._4_4_ = uVar210;
              auVar35._0_4_ = uVar210;
              auVar35._8_4_ = uVar210;
              auVar35._12_4_ = uVar210;
              auVar35._16_4_ = uVar210;
              auVar35._20_4_ = uVar210;
              auVar35._24_4_ = uVar210;
              auVar35._28_4_ = uVar210;
              uVar14 = vcmpps_avx512vl(auVar65,auVar35,2);
              bVar76 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar76 & (byte)uVar14;
            } while (bVar76 != 0);
          }
          uVar15 = vpcmpd_avx512vl(local_4c0,_local_540,1);
          uVar16 = vpcmpd_avx512vl(local_4c0,local_440,1);
          auVar185._0_4_ = (float)local_660._0_4_ + (float)local_1c0._0_4_;
          auVar185._4_4_ = (float)local_660._4_4_ + (float)local_1c0._4_4_;
          auVar185._8_4_ = fStack_658 + fStack_1b8;
          auVar185._12_4_ = fStack_654 + fStack_1b4;
          auVar185._16_4_ = fStack_650 + fStack_1b0;
          auVar185._20_4_ = fStack_64c + fStack_1ac;
          auVar185._24_4_ = fStack_648 + fStack_1a8;
          auVar185._28_4_ = fStack_644 + fStack_1a4;
          uVar210 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar205._4_4_ = uVar210;
          auVar205._0_4_ = uVar210;
          auVar205._8_4_ = uVar210;
          auVar205._12_4_ = uVar210;
          auVar205._16_4_ = uVar210;
          auVar205._20_4_ = uVar210;
          auVar205._24_4_ = uVar210;
          auVar205._28_4_ = uVar210;
          uVar14 = vcmpps_avx512vl(auVar185,auVar205,2);
          bVar76 = (byte)local_8d0 & (byte)uVar16 & (byte)uVar14;
          auVar213._0_4_ = (float)local_660._0_4_ + (float)local_480._0_4_;
          auVar213._4_4_ = (float)local_660._4_4_ + (float)local_480._4_4_;
          auVar213._8_4_ = fStack_658 + fStack_478;
          auVar213._12_4_ = fStack_654 + fStack_474;
          auVar213._16_4_ = fStack_650 + fStack_470;
          auVar213._20_4_ = fStack_64c + fStack_46c;
          auVar213._24_4_ = fStack_648 + fStack_468;
          auVar213._28_4_ = fStack_644 + fStack_464;
          uVar14 = vcmpps_avx512vl(auVar213,auVar205,2);
          bVar70 = bVar70 & (byte)uVar15 & (byte)uVar14 | bVar76;
          prim = local_820;
          pPVar77 = local_828;
          if (bVar70 == 0) {
            auVar214 = ZEXT3264(_DAT_02020f20);
          }
          else {
            uVar81 = local_810 & 0xffffffff;
            abStack_180[uVar81 * 0x60] = bVar70;
            bVar6 = (bool)(bVar76 >> 1 & 1);
            bVar80 = (bool)(bVar76 >> 2 & 1);
            bVar7 = (bool)(bVar76 >> 3 & 1);
            bVar8 = (bool)(bVar76 >> 4 & 1);
            bVar9 = (bool)(bVar76 >> 5 & 1);
            bVar10 = (bool)(bVar76 >> 6 & 1);
            auStack_160[uVar81 * 0x18] =
                 (uint)(bVar76 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar76 & 1) * local_480._0_4_;
            auStack_160[uVar81 * 0x18 + 1] =
                 (uint)bVar6 * local_1c0._4_4_ | (uint)!bVar6 * local_480._4_4_;
            auStack_160[uVar81 * 0x18 + 2] =
                 (uint)bVar80 * (int)fStack_1b8 | (uint)!bVar80 * (int)fStack_478;
            auStack_160[uVar81 * 0x18 + 3] =
                 (uint)bVar7 * (int)fStack_1b4 | (uint)!bVar7 * (int)fStack_474;
            auStack_160[uVar81 * 0x18 + 4] =
                 (uint)bVar8 * (int)fStack_1b0 | (uint)!bVar8 * (int)fStack_470;
            afStack_140[uVar81 * 0x18 + -3] =
                 (float)((uint)bVar9 * (int)fStack_1ac | (uint)!bVar9 * (int)fStack_46c);
            afStack_140[uVar81 * 0x18 + -2] =
                 (float)((uint)bVar10 * (int)fStack_1a8 | (uint)!bVar10 * (int)fStack_468);
            afStack_140[uVar81 * 0x18 + -1] =
                 (float)((uint)(bVar76 >> 7) * (int)fStack_1a4 |
                        (uint)!(bool)(bVar76 >> 7) * (int)fStack_464);
            uVar14 = vmovlps_avx(local_840);
            *(undefined8 *)(afStack_140 + uVar81 * 0x18) = uVar14;
            auStack_138[uVar81 * 0x18] = (int)local_818 + 1;
            local_810 = (ulong)((int)local_810 + 1);
            auVar214 = ZEXT3264(_DAT_02020f20);
          }
        }
      }
    }
    auVar206 = ZEXT1664(local_840);
    local_810 = local_810 & 0xffffffff;
    do {
      if ((int)local_810 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar37._4_4_ = uVar1;
        auVar37._0_4_ = uVar1;
        auVar37._8_4_ = uVar1;
        auVar37._12_4_ = uVar1;
        auVar37._16_4_ = uVar1;
        auVar37._20_4_ = uVar1;
        auVar37._24_4_ = uVar1;
        auVar37._28_4_ = uVar1;
        uVar14 = vcmpps_avx512vl(local_420,auVar37,2);
        uVar78 = (uint)local_808 & (uint)uVar14;
        local_808 = (ulong)uVar78;
        if (uVar78 == 0) {
          return;
        }
        goto LAB_01d06bd4;
      }
      uVar81 = (ulong)((int)local_810 - 1);
      auVar98 = *(undefined1 (*) [32])(auStack_160 + uVar81 * 0x18);
      auVar186._0_4_ = auVar98._0_4_ + (float)local_660._0_4_;
      auVar186._4_4_ = auVar98._4_4_ + (float)local_660._4_4_;
      auVar186._8_4_ = auVar98._8_4_ + fStack_658;
      auVar186._12_4_ = auVar98._12_4_ + fStack_654;
      auVar186._16_4_ = auVar98._16_4_ + fStack_650;
      auVar186._20_4_ = auVar98._20_4_ + fStack_64c;
      auVar186._24_4_ = auVar98._24_4_ + fStack_648;
      auVar186._28_4_ = auVar98._28_4_ + fStack_644;
      uVar210 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar36._4_4_ = uVar210;
      auVar36._0_4_ = uVar210;
      auVar36._8_4_ = uVar210;
      auVar36._12_4_ = uVar210;
      auVar36._16_4_ = uVar210;
      auVar36._20_4_ = uVar210;
      auVar36._24_4_ = uVar210;
      auVar36._28_4_ = uVar210;
      uVar14 = vcmpps_avx512vl(auVar186,auVar36,2);
      uVar75 = (uint)uVar14 & (uint)abStack_180[uVar81 * 0x60];
      bVar70 = (byte)uVar75;
      if (uVar75 != 0) {
        auVar187._8_4_ = 0x7f800000;
        auVar187._0_8_ = 0x7f8000007f800000;
        auVar187._12_4_ = 0x7f800000;
        auVar187._16_4_ = 0x7f800000;
        auVar187._20_4_ = 0x7f800000;
        auVar187._24_4_ = 0x7f800000;
        auVar187._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar187,auVar98);
        auVar138._0_4_ =
             (uint)(bVar70 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar70 & 1) * (int)auVar98._0_4_;
        bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar138._4_4_ = (uint)bVar6 * auVar96._4_4_ | (uint)!bVar6 * (int)auVar98._4_4_;
        bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar138._8_4_ = (uint)bVar6 * auVar96._8_4_ | (uint)!bVar6 * (int)auVar98._8_4_;
        bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar138._12_4_ = (uint)bVar6 * auVar96._12_4_ | (uint)!bVar6 * (int)auVar98._12_4_;
        bVar6 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar138._16_4_ = (uint)bVar6 * auVar96._16_4_ | (uint)!bVar6 * (int)auVar98._16_4_;
        bVar6 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar138._20_4_ = (uint)bVar6 * auVar96._20_4_ | (uint)!bVar6 * (int)auVar98._20_4_;
        bVar6 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar138._24_4_ = (uint)bVar6 * auVar96._24_4_ | (uint)!bVar6 * (int)auVar98._24_4_;
        auVar138._28_4_ =
             (uVar75 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar75 >> 7,0) * (int)auVar98._28_4_;
        auVar98 = vshufps_avx(auVar138,auVar138,0xb1);
        auVar98 = vminps_avx(auVar138,auVar98);
        auVar96 = vshufpd_avx(auVar98,auVar98,5);
        auVar98 = vminps_avx(auVar98,auVar96);
        auVar96 = vpermpd_avx2(auVar98,0x4e);
        auVar98 = vminps_avx(auVar98,auVar96);
        uVar14 = vcmpps_avx512vl(auVar138,auVar98,0);
        bVar76 = (byte)uVar14 & bVar70;
        if (bVar76 != 0) {
          uVar75 = (uint)bVar76;
        }
        fVar146 = afStack_140[uVar81 * 0x18 + 1];
        uVar139 = 0;
        for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
          uVar139 = uVar139 + 1;
        }
        local_818 = (ulong)auStack_138[uVar81 * 0x18];
        bVar76 = ~('\x01' << ((byte)uVar139 & 0x1f)) & bVar70;
        abStack_180[uVar81 * 0x60] = bVar76;
        uVar73 = uVar81;
        if (bVar76 != 0) {
          uVar73 = local_810;
        }
        fVar230 = afStack_140[uVar81 * 0x18];
        auVar188._4_4_ = fVar230;
        auVar188._0_4_ = fVar230;
        auVar188._8_4_ = fVar230;
        auVar188._12_4_ = fVar230;
        auVar188._16_4_ = fVar230;
        auVar188._20_4_ = fVar230;
        auVar188._24_4_ = fVar230;
        auVar188._28_4_ = fVar230;
        fVar146 = fVar146 - fVar230;
        auVar166._4_4_ = fVar146;
        auVar166._0_4_ = fVar146;
        auVar166._8_4_ = fVar146;
        auVar166._12_4_ = fVar146;
        auVar166._16_4_ = fVar146;
        auVar166._20_4_ = fVar146;
        auVar166._24_4_ = fVar146;
        auVar166._28_4_ = fVar146;
        auVar84 = vfmadd132ps_fma(auVar166,auVar188,auVar214._0_32_);
        _local_5e0 = ZEXT1632(auVar84);
        auVar206 = ZEXT864(*(ulong *)(local_5e0 + (ulong)uVar139 * 4));
        uVar81 = uVar73;
      }
      local_810 = uVar81;
    } while (bVar70 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }